

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  _func_int *p_Var4;
  size_t sVar5;
  void *pvVar6;
  _func_int **pp_Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  undefined1 (*pauVar30) [32];
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  ulong uVar33;
  float *pfVar34;
  int j;
  int iVar35;
  ulong uVar36;
  float *pfVar37;
  int iVar38;
  int iVar39;
  int j_4;
  int j_1;
  ulong uVar40;
  long lVar41;
  int _elempack;
  bool bVar42;
  float fVar43;
  float fVar44;
  float fVar107;
  __m128 pos;
  float fVar108;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar212;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar209;
  float fVar211;
  float fVar213;
  float fVar215;
  float fVar217;
  float fVar219;
  float fVar220;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar193 [32];
  float fVar221;
  undefined1 auVar194 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar207 [32];
  float fVar208;
  float fVar210;
  float fVar214;
  float fVar216;
  float fVar218;
  undefined1 in_ZMM1 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  int local_128;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  Mat bottom_blob_bordered;
  Mat local_80;
  ulong local_38;
  undefined1 auVar88 [32];
  undefined1 auVar96 [32];
  undefined1 auVar104 [32];
  undefined1 auVar178 [32];
  undefined1 auVar181 [32];
  undefined1 auVar187 [32];
  undefined1 auVar192 [32];
  undefined1 auVar195 [32];
  undefined1 auVar201 [32];
  undefined1 auVar206 [32];
  
  uVar40 = bottom_blob->elemsize;
  iVar2 = bottom_blob->elempack;
  p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
  iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar39 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered._32_12_ = SUB1612(ZEXT816(0) << 0x40,0);
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.w = bottom_blob_bordered.refcount._4_4_;
  bottom_blob_bordered.d = (int)bottom_blob_bordered.refcount;
  bottom_blob_bordered.c = bottom_blob_bordered.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_avx + (long)p_Var4),bottom_blob,
             &bottom_blob_bordered,opt);
  iVar26 = bottom_blob_bordered.h;
  local_128 = -100;
  if ((bottom_blob_bordered.data != (void *)0x0) &&
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
    uVar3 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    if (opt->use_packing_layout == true) {
      lVar28 = 8;
      if ((uVar3 & 7) != 0) {
        lVar28 = (ulong)((uVar3 & 3) == 0) * 3 + 1;
      }
    }
    else {
      lVar28 = 1;
    }
    _elempack = (int)lVar28;
    iVar29 = (bottom_blob_bordered.w + ~((iVar29 + -1) * iVar39)) /
             *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    uVar27 = (long)(int)uVar3 / (long)_elempack & 0xffffffff;
    iVar39 = (int)((long)(int)uVar3 / (long)_elempack);
    Mat::create(top_blob,iVar29 + 1,iVar39,lVar28 * (uVar40 / (ulong)(long)iVar2),_elempack,
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((iVar2 == 8) && (_elempack == 8)) {
        uVar40 = 0;
        if (0 < iVar26) {
          uVar40 = (ulong)(uint)iVar26;
        }
        uVar33 = 0;
        if (0 < iVar39) {
          uVar33 = uVar27;
        }
        for (uVar32 = 0; uVar32 != uVar33; uVar32 = uVar32 + 1) {
          pauVar30 = (undefined1 (*) [32])
                     ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
          for (iVar35 = 0; iVar35 <= iVar29; iVar35 = iVar35 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx[-3]) == 0) {
              _local_118 = ZEXT1632(ZEXT816(0) << 0x40);
            }
            else {
              _local_118 = *(undefined1 (*) [32])
                            (*(long *)(&this->field_0x190 +
                                      (long)this->_vptr_Convolution1D_x86_avx[-3]) + uVar32 * 0x20);
            }
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar32);
            pfVar34 = (float *)local_80.data;
            Mat::~Mat(&local_80);
            for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar37 = (float *)((long)bottom_blob_bordered.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar35 * 8) * 4
                                 + (long)bottom_blob_bordered.w * bottom_blob_bordered.elemsize *
                                   uVar36);
              iVar38 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar38 = 0;
              }
              while (bVar42 = iVar38 != 0, iVar38 = iVar38 + -1, bVar42) {
                fVar43 = *pfVar37;
                fVar107 = pfVar37[1];
                fVar108 = pfVar37[2];
                fVar44 = pfVar37[3];
                fVar221 = pfVar37[4];
                fVar109 = pfVar37[5];
                fVar110 = pfVar37[6];
                fVar111 = pfVar37[7];
                fVar112 = fVar107 * pfVar34[8] + fVar108 * pfVar34[0x10];
                fVar208 = fVar107 * pfVar34[9] + fVar108 * pfVar34[0x11];
                fVar210 = fVar107 * pfVar34[10] + fVar108 * pfVar34[0x12];
                fVar212 = fVar107 * pfVar34[0xb] + fVar108 * pfVar34[0x13];
                fVar214 = fVar107 * pfVar34[0xc] + fVar108 * pfVar34[0x14];
                fVar216 = fVar107 * pfVar34[0xd] + fVar108 * pfVar34[0x15];
                fVar218 = fVar107 * pfVar34[0xe] + fVar108 * pfVar34[0x16];
                in_ZMM1 = ZEXT3264(CONCAT428(fVar107 + fVar108,
                                             CONCAT424(fVar218,CONCAT420(fVar216,CONCAT416(fVar214,
                                                  CONCAT412(fVar212,CONCAT48(fVar210,CONCAT44(
                                                  fVar208,fVar112))))))));
                local_118._0_4_ =
                     fVar43 * *pfVar34 + (float)local_118._0_4_ + fVar112 +
                     fVar44 * pfVar34[0x18] + fVar221 * pfVar34[0x20] + fVar109 * pfVar34[0x28] +
                     fVar110 * pfVar34[0x30] + fVar111 * pfVar34[0x38];
                local_118._4_4_ =
                     fVar43 * pfVar34[1] + (float)local_118._4_4_ + fVar208 +
                     fVar44 * pfVar34[0x19] + fVar221 * pfVar34[0x21] + fVar109 * pfVar34[0x29] +
                     fVar110 * pfVar34[0x31] + fVar111 * pfVar34[0x39];
                fStack_110 = fVar43 * pfVar34[2] + fStack_110 + fVar210 +
                             fVar44 * pfVar34[0x1a] + fVar221 * pfVar34[0x22] +
                             fVar109 * pfVar34[0x2a] +
                             fVar110 * pfVar34[0x32] + fVar111 * pfVar34[0x3a];
                fStack_10c = fVar43 * pfVar34[3] + fStack_10c + fVar212 +
                             fVar44 * pfVar34[0x1b] + fVar221 * pfVar34[0x23] +
                             fVar109 * pfVar34[0x2b] +
                             fVar110 * pfVar34[0x33] + fVar111 * pfVar34[0x3b];
                fStack_108 = fVar43 * pfVar34[4] + fStack_108 + fVar214 +
                             fVar44 * pfVar34[0x1c] + fVar221 * pfVar34[0x24] +
                             fVar109 * pfVar34[0x2c] +
                             fVar110 * pfVar34[0x34] + fVar111 * pfVar34[0x3c];
                fStack_104 = fVar43 * pfVar34[5] + fStack_104 + fVar216 +
                             fVar44 * pfVar34[0x1d] + fVar221 * pfVar34[0x25] +
                             fVar109 * pfVar34[0x2d] +
                             fVar110 * pfVar34[0x35] + fVar111 * pfVar34[0x3d];
                fStack_100 = fVar43 * pfVar34[6] + fStack_100 + fVar218 +
                             fVar44 * pfVar34[0x1e] + fVar221 * pfVar34[0x26] +
                             fVar109 * pfVar34[0x2e] +
                             fVar110 * pfVar34[0x36] + fVar111 * pfVar34[0x3e];
                fStack_fc = fVar43 + fStack_fc + fVar107 + fVar108 + fVar44 + fVar108 + fVar44 +
                            fVar221 + fVar44;
                pfVar37 = pfVar37 + (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * 8;
                pfVar34 = pfVar34 + 0x40;
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
            auVar89 = _local_118;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto switchD_002e2823_caseD_1;
            auVar113 = ZEXT816(0) << 0x40;
            auVar89 = vmaxps_avx(_local_118,ZEXT1632(auVar113));
            fVar43 = local_118._0_4_;
            fVar107 = local_118._4_4_;
            fVar108 = local_118._8_4_;
            fVar44 = local_118._12_4_;
            fVar221 = local_118._16_4_;
            fVar109 = local_118._20_4_;
            fVar110 = local_118._24_4_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar90 = vminps_avx(_local_118,ZEXT1632(auVar113));
              fVar43 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar9._4_4_ = fVar43 * auVar90._4_4_;
              auVar9._0_4_ = fVar43 * auVar90._0_4_;
              auVar9._8_4_ = fVar43 * auVar90._8_4_;
              auVar9._12_4_ = fVar43 * auVar90._12_4_;
              auVar9._16_4_ = fVar43 * auVar90._16_4_;
              auVar9._20_4_ = fVar43 * auVar90._20_4_;
              auVar9._24_4_ = fVar43 * auVar90._24_4_;
              auVar9._28_4_ = auVar90._28_4_;
              goto LAB_002e2ca1;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar85._4_4_ = uVar1;
              auVar85._0_4_ = uVar1;
              auVar85._8_4_ = uVar1;
              auVar85._12_4_ = uVar1;
              auVar85._16_4_ = uVar1;
              auVar85._20_4_ = uVar1;
              auVar85._24_4_ = uVar1;
              auVar85._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar174._4_4_ = uVar1;
              auVar174._0_4_ = uVar1;
              auVar174._8_4_ = uVar1;
              auVar174._12_4_ = uVar1;
              auVar174._16_4_ = uVar1;
              auVar174._20_4_ = uVar1;
              auVar174._24_4_ = uVar1;
              auVar174._28_4_ = uVar1;
              in_ZMM1 = ZEXT3264(auVar174);
              auVar89 = vmaxps_avx(_local_118,auVar85);
              auVar89 = vminps_avx(auVar89,auVar174);
              break;
            case 4:
              auVar86._0_8_ = local_118 ^ 0x8000000080000000;
              auVar86._8_4_ = -fVar108;
              auVar86._12_4_ = -fVar44;
              auVar86._16_4_ = -fVar221;
              auVar86._20_4_ = -fVar109;
              auVar86._24_4_ = -fVar110;
              auVar86._28_4_ = local_118._28_4_ ^ 0x80000000;
              auVar175._8_4_ = 0x42b0c0a5;
              auVar175._0_8_ = 0x42b0c0a542b0c0a5;
              auVar175._12_4_ = 0x42b0c0a5;
              auVar175._16_4_ = 0x42b0c0a5;
              auVar175._20_4_ = 0x42b0c0a5;
              auVar175._24_4_ = 0x42b0c0a5;
              auVar175._28_4_ = 0x42b0c0a5;
              auVar89 = vminps_avx(auVar86,auVar175);
              auVar176._8_4_ = 0xc2b0c0a5;
              auVar176._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar176._12_4_ = 0xc2b0c0a5;
              auVar176._16_4_ = 0xc2b0c0a5;
              auVar176._20_4_ = 0xc2b0c0a5;
              auVar176._24_4_ = 0xc2b0c0a5;
              auVar176._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar89,auVar176);
              auVar177._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
              auVar177._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
              auVar177._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
              auVar177._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
              auVar177._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
              auVar177._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
              auVar177._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
              auVar177._28_4_ = 0x3ff8aa3b;
              auVar179 = vroundps_avx(auVar177,1);
              auVar89 = vcmpps_avx(auVar177,auVar179,1);
              auVar278._8_4_ = 0x3f800000;
              auVar278._0_8_ = 0x3f8000003f800000;
              auVar278._12_4_ = 0x3f800000;
              auVar278._16_4_ = 0x3f800000;
              auVar278._20_4_ = 0x3f800000;
              auVar278._24_4_ = 0x3f800000;
              auVar278._28_4_ = 0x3f800000;
              auVar89 = vandps_avx(auVar89,auVar278);
              auVar89 = vsubps_avx(auVar179,auVar89);
              fVar43 = auVar90._0_4_ + auVar89._0_4_ * -0.6931472;
              fVar107 = auVar90._4_4_ + auVar89._4_4_ * -0.6931472;
              fVar108 = auVar90._8_4_ + auVar89._8_4_ * -0.6931472;
              fVar44 = auVar90._12_4_ + auVar89._12_4_ * -0.6931472;
              fVar221 = auVar90._16_4_ + auVar89._16_4_ * -0.6931472;
              fVar109 = auVar90._20_4_ + auVar89._20_4_ * -0.6931472;
              fVar110 = auVar90._24_4_ + auVar89._24_4_ * -0.6931472;
              auVar114._0_4_ = (int)auVar89._0_4_;
              auVar114._4_4_ = (int)auVar89._4_4_;
              auVar114._8_4_ = (int)auVar89._8_4_;
              auVar114._12_4_ = (int)auVar89._12_4_;
              auVar178._16_4_ = (int)auVar89._16_4_;
              auVar178._0_16_ = auVar114;
              auVar178._20_4_ = (int)auVar89._20_4_;
              auVar178._24_4_ = (int)auVar89._24_4_;
              auVar178._28_4_ = (int)auVar89._28_4_;
              auVar222 = vpslld_avx(auVar114,0x17);
              auVar113 = vpslld_avx(auVar178._16_16_,0x17);
              auVar250._8_4_ = 0x3f800000;
              auVar250._0_8_ = 0x3f8000003f800000;
              auVar250._12_4_ = 0x3f800000;
              auVar113 = vpaddd_avx(auVar113,auVar250);
              auVar222 = vpaddd_avx(auVar222,auVar250);
              auVar87._0_4_ =
                   (fVar43 + 1.0 +
                   fVar43 * fVar43 *
                   (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                     0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar222._0_4_ + 1.0;
              auVar87._4_4_ =
                   (fVar107 + 1.0 +
                   fVar107 * fVar107 *
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar222._4_4_ + 1.0;
              auVar87._8_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar222._8_4_ + 1.0;
              auVar87._12_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar222._12_4_ + 1.0;
              auVar87._16_4_ =
                   (fVar221 + 1.0 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar87._20_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar87._24_4_ =
                   (fVar110 + 1.0 +
                   fVar110 * fVar110 *
                   (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110 +
                     0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar87._28_4_ = auVar90._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
              auVar9 = vrcpps_avx(auVar87);
              auVar15._4_4_ = auVar87._4_4_ * auVar9._4_4_;
              auVar15._0_4_ = auVar87._0_4_ * auVar9._0_4_;
              auVar15._8_4_ = auVar87._8_4_ * auVar9._8_4_;
              auVar15._12_4_ = auVar87._12_4_ * auVar9._12_4_;
              auVar15._16_4_ = auVar87._16_4_ * auVar9._16_4_;
              auVar15._20_4_ = auVar87._20_4_ * auVar9._20_4_;
              auVar15._24_4_ = auVar87._24_4_ * auVar9._24_4_;
              auVar15._28_4_ = auVar87._28_4_;
              auVar90 = vsubps_avx(auVar278,auVar15);
              auVar89._4_4_ = auVar9._4_4_ * auVar90._4_4_;
              auVar89._0_4_ = auVar9._0_4_ * auVar90._0_4_;
              auVar89._8_4_ = auVar9._8_4_ * auVar90._8_4_;
              auVar89._12_4_ = auVar9._12_4_ * auVar90._12_4_;
              auVar89._16_4_ = auVar9._16_4_ * auVar90._16_4_;
              auVar89._20_4_ = auVar9._20_4_ * auVar90._20_4_;
              auVar89._24_4_ = auVar9._24_4_ * auVar90._24_4_;
              auVar89._28_4_ = auVar90._28_4_;
LAB_002e2ca1:
              in_ZMM1 = ZEXT3264(auVar9);
              auVar88._0_4_ = auVar9._0_4_ + auVar89._0_4_;
              auVar88._4_4_ = auVar9._4_4_ + auVar89._4_4_;
              auVar88._8_4_ = auVar9._8_4_ + auVar89._8_4_;
              auVar88._12_4_ = auVar9._12_4_ + auVar89._12_4_;
              auVar88._16_4_ = auVar9._16_4_ + auVar89._16_4_;
              auVar88._20_4_ = auVar9._20_4_ + auVar89._20_4_;
              auVar88._24_4_ = auVar9._24_4_ + auVar89._24_4_;
              auVar88._28_4_ = auVar9._28_4_ + auVar89._28_4_;
              auVar89 = auVar88;
              break;
            case 5:
              auVar287._8_4_ = 0x42b0c0a5;
              auVar287._0_8_ = 0x42b0c0a542b0c0a5;
              auVar287._12_4_ = 0x42b0c0a5;
              auVar287._16_4_ = 0x42b0c0a5;
              auVar287._20_4_ = 0x42b0c0a5;
              auVar287._24_4_ = 0x42b0c0a5;
              auVar287._28_4_ = 0x42b0c0a5;
              auVar89 = vminps_avx(_local_118,auVar287);
              auVar293._8_4_ = 0xc2b0c0a5;
              auVar293._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar293._12_4_ = 0xc2b0c0a5;
              auVar293._16_4_ = 0xc2b0c0a5;
              auVar293._20_4_ = 0xc2b0c0a5;
              auVar293._24_4_ = 0xc2b0c0a5;
              auVar293._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar89,auVar293);
              auVar299._8_4_ = 0x3f000000;
              auVar299._0_8_ = 0x3f0000003f000000;
              auVar299._12_4_ = 0x3f000000;
              auVar299._16_4_ = 0x3f000000;
              auVar299._20_4_ = 0x3f000000;
              auVar299._24_4_ = 0x3f000000;
              auVar299._28_4_ = 0x3f000000;
              auVar166._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
              auVar166._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
              auVar166._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
              auVar166._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
              auVar166._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
              auVar166._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
              auVar166._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
              auVar166._28_4_ = in_ZMM1._28_4_ + 0.5;
              auVar179 = vroundps_avx(auVar166,1);
              auVar89 = vcmpps_avx(auVar166,auVar179,1);
              auVar305._8_4_ = 0x3f800000;
              auVar305._0_8_ = 0x3f8000003f800000;
              auVar305._12_4_ = 0x3f800000;
              auVar305._16_4_ = 0x3f800000;
              auVar305._20_4_ = 0x3f800000;
              auVar305._24_4_ = 0x3f800000;
              auVar305._28_4_ = 0x3f800000;
              auVar89 = vandps_avx(auVar305,auVar89);
              auVar89 = vsubps_avx(auVar179,auVar89);
              auVar8._4_4_ = auVar89._4_4_ * 0.6931472;
              auVar8._0_4_ = auVar89._0_4_ * 0.6931472;
              auVar8._8_4_ = auVar89._8_4_ * 0.6931472;
              auVar8._12_4_ = auVar89._12_4_ * 0.6931472;
              auVar8._16_4_ = auVar89._16_4_ * 0.6931472;
              auVar8._20_4_ = auVar89._20_4_ * 0.6931472;
              auVar8._24_4_ = auVar89._24_4_ * 0.6931472;
              auVar8._28_4_ = auVar179._28_4_;
              auVar90 = vsubps_avx(auVar90,auVar8);
              fVar111 = auVar90._0_4_;
              fVar112 = auVar90._4_4_;
              fVar208 = auVar90._8_4_;
              fVar210 = auVar90._12_4_;
              fVar212 = auVar90._16_4_;
              fVar214 = auVar90._20_4_;
              fVar216 = auVar90._24_4_;
              auVar113._0_4_ = (int)auVar89._0_4_;
              auVar113._4_4_ = (int)auVar89._4_4_;
              auVar113._8_4_ = (int)auVar89._8_4_;
              auVar113._12_4_ = (int)auVar89._12_4_;
              auVar167._16_4_ = (int)auVar89._16_4_;
              auVar167._0_16_ = auVar113;
              auVar167._20_4_ = (int)auVar89._20_4_;
              auVar167._24_4_ = (int)auVar89._24_4_;
              auVar167._28_4_ = (int)auVar89._28_4_;
              auVar222 = vpslld_avx(auVar113,0x17);
              auVar113 = vpslld_avx(auVar167._16_16_,0x17);
              auVar281._8_4_ = 0x3f800000;
              auVar281._0_8_ = 0x3f8000003f800000;
              auVar281._12_4_ = 0x3f800000;
              auVar113 = vpaddd_avx(auVar113,auVar281);
              auVar222 = vpaddd_avx(auVar222,auVar281);
              auVar83._0_4_ =
                   (fVar111 + 1.0 +
                   fVar111 * fVar111 *
                   (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
                     0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar222._0_4_ + 1.0;
              auVar83._4_4_ =
                   (fVar112 + 1.0 +
                   fVar112 * fVar112 *
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                     0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5)) * auVar222._4_4_ + 1.0;
              auVar83._8_4_ =
                   (fVar208 + 1.0 +
                   fVar208 * fVar208 *
                   (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                     0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5)) * auVar222._8_4_ + 1.0;
              auVar83._12_4_ =
                   (fVar210 + 1.0 +
                   fVar210 * fVar210 *
                   (((((fVar210 * 0.00019875691 + 0.0013981999) * fVar210 + 0.008333452) * fVar210 +
                     0.041665796) * fVar210 + 0.16666666) * fVar210 + 0.5)) * auVar222._12_4_ + 1.0;
              auVar83._16_4_ =
                   (fVar212 + 1.0 +
                   fVar212 * fVar212 *
                   (((((fVar212 * 0.00019875691 + 0.0013981999) * fVar212 + 0.008333452) * fVar212 +
                     0.041665796) * fVar212 + 0.16666666) * fVar212 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar83._20_4_ =
                   (fVar214 + 1.0 +
                   fVar214 * fVar214 *
                   (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) * fVar214 +
                     0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar83._24_4_ =
                   (fVar216 + 1.0 +
                   fVar216 * fVar216 *
                   (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216 +
                     0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar83._28_4_ = auVar90._28_4_ + 1.0 + auVar179._28_4_ + 1.0;
              auVar168._8_4_ = 0x800000;
              auVar168._0_8_ = 0x80000000800000;
              auVar168._12_4_ = 0x800000;
              auVar168._16_4_ = 0x800000;
              auVar168._20_4_ = 0x800000;
              auVar168._24_4_ = 0x800000;
              auVar168._28_4_ = 0x800000;
              auVar179 = vmaxps_avx(auVar83,auVar168);
              auVar113 = vpsrld_avx(auVar179._16_16_,0x17);
              auVar169._8_4_ = 0x807fffff;
              auVar169._0_8_ = 0x807fffff807fffff;
              auVar169._12_4_ = 0x807fffff;
              auVar169._16_4_ = 0x807fffff;
              auVar169._20_4_ = 0x807fffff;
              auVar169._24_4_ = 0x807fffff;
              auVar169._28_4_ = 0x807fffff;
              auVar89 = vandps_avx(auVar179,auVar169);
              auVar8 = vorps_avx(auVar299,auVar89);
              auVar268._8_4_ = 0x3f3504f3;
              auVar268._0_8_ = 0x3f3504f33f3504f3;
              auVar268._12_4_ = 0x3f3504f3;
              auVar268._16_4_ = 0x3f3504f3;
              auVar268._20_4_ = 0x3f3504f3;
              auVar268._24_4_ = 0x3f3504f3;
              auVar268._28_4_ = 0x3f3504f3;
              auVar90 = vcmpps_avx(auVar268,auVar8,2);
              auVar89 = vandnps_avx(auVar90,auVar8);
              fVar111 = auVar8._0_4_ + -1.0 + auVar89._0_4_;
              fVar112 = auVar8._4_4_ + -1.0 + auVar89._4_4_;
              fVar208 = auVar8._8_4_ + -1.0 + auVar89._8_4_;
              fVar210 = auVar8._12_4_ + -1.0 + auVar89._12_4_;
              fVar212 = auVar8._16_4_ + -1.0 + auVar89._16_4_;
              fVar214 = auVar8._20_4_ + -1.0 + auVar89._20_4_;
              fVar216 = auVar8._24_4_ + -1.0 + auVar89._24_4_;
              auVar113 = vpsubd_avx(auVar113,auVar90._16_16_);
              auVar222 = vpsrld_avx(auVar179._0_16_,0x17);
              auVar272._8_4_ = 0xffffff81;
              auVar272._0_8_ = 0xffffff81ffffff81;
              auVar272._12_4_ = 0xffffff81;
              auVar113 = vpaddd_avx(auVar113,auVar272);
              auVar222 = vpsubd_avx(auVar222,auVar90._0_16_);
              auVar222 = vpaddd_avx(auVar222,auVar272);
              auVar244._16_16_ = auVar113;
              auVar244._0_16_ = auVar222;
              auVar90 = vcmpps_avx(auVar83,_DAT_002f0280,2);
              auVar179 = vcvtdq2ps_avx(auVar244);
              auVar12._4_4_ =
                   (auVar179._4_4_ * 0.6931472 + fVar112 +
                   fVar112 * fVar112 *
                   (((((((((fVar112 * 0.070376836 + -0.1151461) * fVar112 + 0.116769984) * fVar112 +
                         -0.12420141) * fVar112 + 0.14249323) * fVar112 + -0.16668057) * fVar112 +
                      0.20000714) * fVar112 + -0.24999994) * fVar112 + 0.3333333) * fVar112 + -0.5))
                   * -2.0;
              auVar12._0_4_ =
                   (auVar179._0_4_ * 0.6931472 + fVar111 +
                   fVar111 * fVar111 *
                   (((((((((fVar111 * 0.070376836 + -0.1151461) * fVar111 + 0.116769984) * fVar111 +
                         -0.12420141) * fVar111 + 0.14249323) * fVar111 + -0.16668057) * fVar111 +
                      0.20000714) * fVar111 + -0.24999994) * fVar111 + 0.3333333) * fVar111 + -0.5))
                   * -2.0;
              auVar12._8_4_ =
                   (auVar179._8_4_ * 0.6931472 + fVar208 +
                   fVar208 * fVar208 *
                   (((((((((fVar208 * 0.070376836 + -0.1151461) * fVar208 + 0.116769984) * fVar208 +
                         -0.12420141) * fVar208 + 0.14249323) * fVar208 + -0.16668057) * fVar208 +
                      0.20000714) * fVar208 + -0.24999994) * fVar208 + 0.3333333) * fVar208 + -0.5))
                   * -2.0;
              auVar12._12_4_ =
                   (auVar179._12_4_ * 0.6931472 + fVar210 +
                   fVar210 * fVar210 *
                   (((((((((fVar210 * 0.070376836 + -0.1151461) * fVar210 + 0.116769984) * fVar210 +
                         -0.12420141) * fVar210 + 0.14249323) * fVar210 + -0.16668057) * fVar210 +
                      0.20000714) * fVar210 + -0.24999994) * fVar210 + 0.3333333) * fVar210 + -0.5))
                   * -2.0;
              auVar12._16_4_ =
                   (auVar179._16_4_ * 0.6931472 + fVar212 +
                   fVar212 * fVar212 *
                   (((((((((fVar212 * 0.070376836 + -0.1151461) * fVar212 + 0.116769984) * fVar212 +
                         -0.12420141) * fVar212 + 0.14249323) * fVar212 + -0.16668057) * fVar212 +
                      0.20000714) * fVar212 + -0.24999994) * fVar212 + 0.3333333) * fVar212 + -0.5))
                   * -2.0;
              auVar12._20_4_ =
                   (auVar179._20_4_ * 0.6931472 + fVar214 +
                   fVar214 * fVar214 *
                   (((((((((fVar214 * 0.070376836 + -0.1151461) * fVar214 + 0.116769984) * fVar214 +
                         -0.12420141) * fVar214 + 0.14249323) * fVar214 + -0.16668057) * fVar214 +
                      0.20000714) * fVar214 + -0.24999994) * fVar214 + 0.3333333) * fVar214 + -0.5))
                   * -2.0;
              auVar12._24_4_ =
                   (auVar179._24_4_ * 0.6931472 + fVar216 +
                   fVar216 * fVar216 *
                   (((((((((fVar216 * 0.070376836 + -0.1151461) * fVar216 + 0.116769984) * fVar216 +
                         -0.12420141) * fVar216 + 0.14249323) * fVar216 + -0.16668057) * fVar216 +
                      0.20000714) * fVar216 + -0.24999994) * fVar216 + 0.3333333) * fVar216 + -0.5))
                   * -2.0;
              auVar12._28_4_ = auVar179._28_4_ + auVar8._28_4_ + -1.0 + auVar89._28_4_ + 0.0;
              auVar245._8_4_ = 0x7fffffff;
              auVar245._0_8_ = 0x7fffffff7fffffff;
              auVar245._12_4_ = 0x7fffffff;
              auVar245._16_4_ = 0x7fffffff;
              auVar245._20_4_ = 0x7fffffff;
              auVar245._24_4_ = 0x7fffffff;
              auVar245._28_4_ = 0x7fffffff;
              auVar89 = vblendvps_avx(auVar12,auVar245,auVar90);
              auVar170._8_4_ = 0x42b0c0a5;
              auVar170._0_8_ = 0x42b0c0a542b0c0a5;
              auVar170._12_4_ = 0x42b0c0a5;
              auVar170._16_4_ = 0x42b0c0a5;
              auVar170._20_4_ = 0x42b0c0a5;
              auVar170._24_4_ = 0x42b0c0a5;
              auVar170._28_4_ = 0x42b0c0a5;
              auVar89 = vminps_avx(auVar89,auVar170);
              auVar171._8_4_ = 0xc2b0c0a5;
              auVar171._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar171._12_4_ = 0xc2b0c0a5;
              auVar171._16_4_ = 0xc2b0c0a5;
              auVar171._20_4_ = 0xc2b0c0a5;
              auVar171._24_4_ = 0xc2b0c0a5;
              auVar171._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar89,auVar171);
              auVar172._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
              auVar172._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
              auVar172._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
              auVar172._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
              auVar172._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
              auVar172._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
              auVar172._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
              auVar172._28_4_ = 0x3ff8aa3b;
              auVar179 = vroundps_avx(auVar172,1);
              auVar89 = vcmpps_avx(auVar172,auVar179,1);
              auVar89 = vandps_avx(auVar305,auVar89);
              auVar89 = vsubps_avx(auVar179,auVar89);
              auVar13._4_4_ = auVar89._4_4_ * 0.6931472;
              auVar13._0_4_ = auVar89._0_4_ * 0.6931472;
              auVar13._8_4_ = auVar89._8_4_ * 0.6931472;
              auVar13._12_4_ = auVar89._12_4_ * 0.6931472;
              auVar13._16_4_ = auVar89._16_4_ * 0.6931472;
              auVar13._20_4_ = auVar89._20_4_ * 0.6931472;
              auVar13._24_4_ = auVar89._24_4_ * 0.6931472;
              auVar13._28_4_ = auVar179._28_4_;
              auVar90 = vsubps_avx(auVar90,auVar13);
              fVar111 = auVar90._0_4_;
              fVar112 = auVar90._4_4_;
              fVar208 = auVar90._8_4_;
              fVar210 = auVar90._12_4_;
              fVar212 = auVar90._16_4_;
              fVar214 = auVar90._20_4_;
              fVar216 = auVar90._24_4_;
              auVar222._0_4_ = (int)auVar89._0_4_;
              auVar222._4_4_ = (int)auVar89._4_4_;
              auVar222._8_4_ = (int)auVar89._8_4_;
              auVar222._12_4_ = (int)auVar89._12_4_;
              auVar173._16_4_ = (int)auVar89._16_4_;
              auVar173._0_16_ = auVar222;
              auVar173._20_4_ = (int)auVar89._20_4_;
              auVar173._24_4_ = (int)auVar89._24_4_;
              auVar173._28_4_ = (int)auVar89._28_4_;
              auVar222 = vpslld_avx(auVar222,0x17);
              auVar113 = vpslld_avx(auVar173._16_16_,0x17);
              auVar113 = vpaddd_avx(auVar113,auVar281);
              auVar222 = vpaddd_avx(auVar222,auVar281);
              auVar84._0_4_ =
                   (fVar111 + 1.0 +
                   fVar111 * fVar111 *
                   (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
                     0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar222._0_4_ + 1.0;
              auVar84._4_4_ =
                   (fVar112 + 1.0 +
                   fVar112 * fVar112 *
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                     0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5)) * auVar222._4_4_ + 1.0;
              auVar84._8_4_ =
                   (fVar208 + 1.0 +
                   fVar208 * fVar208 *
                   (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                     0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5)) * auVar222._8_4_ + 1.0;
              auVar84._12_4_ =
                   (fVar210 + 1.0 +
                   fVar210 * fVar210 *
                   (((((fVar210 * 0.00019875691 + 0.0013981999) * fVar210 + 0.008333452) * fVar210 +
                     0.041665796) * fVar210 + 0.16666666) * fVar210 + 0.5)) * auVar222._12_4_ + 1.0;
              auVar84._16_4_ =
                   (fVar212 + 1.0 +
                   fVar212 * fVar212 *
                   (((((fVar212 * 0.00019875691 + 0.0013981999) * fVar212 + 0.008333452) * fVar212 +
                     0.041665796) * fVar212 + 0.16666666) * fVar212 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar84._20_4_ =
                   (fVar214 + 1.0 +
                   fVar214 * fVar214 *
                   (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) * fVar214 +
                     0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar84._24_4_ =
                   (fVar216 + 1.0 +
                   fVar216 * fVar216 *
                   (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216 +
                     0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar84._28_4_ = auVar90._28_4_ + 1.0 + auVar179._28_4_ + 1.0;
              auVar89 = vrcpps_avx(auVar84);
              fVar111 = auVar89._0_4_;
              fVar112 = auVar89._4_4_;
              fVar208 = auVar89._8_4_;
              fVar210 = auVar89._12_4_;
              fVar212 = auVar89._16_4_;
              fVar214 = auVar89._20_4_;
              fVar216 = auVar89._24_4_;
              auVar14._4_4_ = auVar84._4_4_ * (fVar112 + fVar112);
              auVar14._0_4_ = auVar84._0_4_ * (fVar111 + fVar111);
              auVar14._8_4_ = auVar84._8_4_ * (fVar208 + fVar208);
              auVar14._12_4_ = auVar84._12_4_ * (fVar210 + fVar210);
              auVar14._16_4_ = auVar84._16_4_ * (fVar212 + fVar212);
              auVar14._20_4_ = auVar84._20_4_ * (fVar214 + fVar214);
              auVar14._24_4_ = auVar84._24_4_ * (fVar216 + fVar216);
              auVar14._28_4_ = auVar84._28_4_;
              auVar265._8_4_ = 0x40000000;
              auVar265._0_8_ = 0x4000000040000000;
              auVar265._12_4_ = 0x40000000;
              auVar265._16_4_ = 0x40000000;
              auVar265._20_4_ = 0x40000000;
              auVar265._24_4_ = 0x40000000;
              auVar265._28_4_ = 0x40000000;
              auVar90 = vsubps_avx(auVar265,auVar14);
              fVar218 = fVar111 + fVar111 + -1.0;
              fVar209 = fVar112 + fVar112 + -1.0;
              fVar211 = fVar208 + fVar208 + -1.0;
              fVar213 = fVar210 + fVar210 + -1.0;
              fVar215 = fVar212 + fVar212 + -1.0;
              fVar217 = fVar214 + fVar214 + -1.0;
              fVar219 = fVar216 + fVar216 + -1.0;
              fVar220 = auVar89._28_4_ + auVar89._28_4_ + -1.0;
              in_ZMM1 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar219,CONCAT420(fVar217,CONCAT416(
                                                  fVar215,CONCAT412(fVar213,CONCAT48(fVar211,
                                                  CONCAT44(fVar209,fVar218))))))));
              auVar89._4_4_ = (fVar209 + fVar112 * auVar90._4_4_) * fVar107;
              auVar89._0_4_ = (fVar218 + fVar111 * auVar90._0_4_) * fVar43;
              auVar89._8_4_ = (fVar211 + fVar208 * auVar90._8_4_) * fVar108;
              auVar89._12_4_ = (fVar213 + fVar210 * auVar90._12_4_) * fVar44;
              auVar89._16_4_ = (fVar215 + fVar212 * auVar90._16_4_) * fVar221;
              auVar89._20_4_ = (fVar217 + fVar214 * auVar90._20_4_) * fVar109;
              auVar89._24_4_ = (fVar219 + fVar216 * auVar90._24_4_) * fVar110;
              auVar89._28_4_ = fVar220 + auVar90._28_4_;
              break;
            case 6:
              fVar111 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar112 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar90._0_4_ = fVar111 * fVar43 + fVar112;
              auVar90._4_4_ = fVar111 * fVar107 + fVar112;
              auVar90._8_4_ = fVar111 * fVar108 + fVar112;
              auVar90._12_4_ = fVar111 * fVar44 + fVar112;
              auVar90._16_4_ = fVar111 * fVar221 + fVar112;
              auVar90._20_4_ = fVar111 * fVar109 + fVar112;
              auVar90._24_4_ = fVar111 * fVar110 + fVar112;
              auVar90._28_4_ = fVar111 + fVar112;
              auVar89 = vmaxps_avx(auVar90,ZEXT1632(auVar113));
              auVar179._8_4_ = 0x3f800000;
              auVar179._0_8_ = 0x3f8000003f800000;
              auVar179._12_4_ = 0x3f800000;
              auVar179._16_4_ = 0x3f800000;
              auVar179._20_4_ = 0x3f800000;
              auVar179._24_4_ = 0x3f800000;
              auVar179._28_4_ = 0x3f800000;
              in_ZMM1 = ZEXT3264(auVar179);
              auVar90 = vminps_avx(auVar89,auVar179);
              auVar89._4_4_ = auVar90._4_4_ * fVar107;
              auVar89._0_4_ = auVar90._0_4_ * fVar43;
              auVar89._8_4_ = auVar90._8_4_ * fVar108;
              auVar89._12_4_ = auVar90._12_4_ * fVar44;
              auVar89._16_4_ = auVar90._16_4_ * fVar221;
              auVar89._20_4_ = auVar90._20_4_ * fVar109;
              auVar89._24_4_ = auVar90._24_4_ * fVar110;
              auVar89._28_4_ = auVar90._28_4_;
            }
switchD_002e2823_caseD_1:
            *pauVar30 = auVar89;
            pauVar30 = pauVar30 + 1;
          }
        }
      }
      if ((iVar2 == 1) && (_elempack == 8)) {
        uVar40 = 0;
        if (0 < iVar26) {
          uVar40 = (ulong)(uint)iVar26;
        }
        uVar33 = 0;
        if (0 < iVar39) {
          uVar33 = uVar27;
        }
        for (uVar32 = 0; uVar32 != uVar33; uVar32 = uVar32 + 1) {
          pauVar30 = (undefined1 (*) [32])
                     ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
          for (iVar35 = 0; iVar35 <= iVar29; iVar35 = iVar35 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx[-3]) == 0) {
              _local_118 = ZEXT1632(ZEXT816(0) << 0x40);
            }
            else {
              _local_118 = *(undefined1 (*) [32])
                            (*(long *)(&this->field_0x190 +
                                      (long)this->_vptr_Convolution1D_x86_avx[-3]) + uVar32 * 0x20);
            }
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar32);
            pfVar34 = (float *)local_80.data;
            Mat::~Mat(&local_80);
            for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar37 = (float *)((long)bottom_blob_bordered.data +
                                 (long)iVar35 * (long)*(int *)(&this->field_0xdc + (long)p_Var4) * 4
                                 + (long)bottom_blob_bordered.w * bottom_blob_bordered.elemsize *
                                   uVar36);
              iVar38 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar38 = 0;
              }
              while (bVar42 = iVar38 != 0, iVar38 = iVar38 + -1, bVar42) {
                fVar43 = *pfVar37;
                local_118._0_4_ = fVar43 * *pfVar34 + (float)local_118._0_4_;
                local_118._4_4_ = fVar43 * pfVar34[1] + (float)local_118._4_4_;
                fStack_110 = fVar43 * pfVar34[2] + fStack_110;
                fStack_10c = fVar43 * pfVar34[3] + fStack_10c;
                fStack_108 = fVar43 * pfVar34[4] + fStack_108;
                fStack_104 = fVar43 * pfVar34[5] + fStack_104;
                fStack_100 = fVar43 * pfVar34[6] + fStack_100;
                fStack_fc = fVar43 + fStack_fc;
                in_ZMM1 = ZEXT3264(_local_118);
                pfVar37 = pfVar37 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                pfVar34 = pfVar34 + 8;
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
            auVar96 = _local_118;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto LAB_002e3374;
            auVar113 = ZEXT816(0) << 0x40;
            auVar97 = vmaxps_avx(_local_118,ZEXT1632(auVar113));
            fVar43 = local_118._0_4_;
            fVar107 = local_118._4_4_;
            fVar108 = local_118._8_4_;
            fVar44 = local_118._12_4_;
            fVar221 = local_118._16_4_;
            fVar109 = local_118._20_4_;
            fVar110 = local_118._24_4_;
            auVar96 = auVar97;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar89 = vminps_avx(_local_118,ZEXT1632(auVar113));
              fVar43 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar10._4_4_ = fVar43 * auVar89._4_4_;
              auVar10._0_4_ = fVar43 * auVar89._0_4_;
              auVar10._8_4_ = fVar43 * auVar89._8_4_;
              auVar10._12_4_ = fVar43 * auVar89._12_4_;
              auVar10._16_4_ = fVar43 * auVar89._16_4_;
              auVar10._20_4_ = fVar43 * auVar89._20_4_;
              auVar10._24_4_ = fVar43 * auVar89._24_4_;
              auVar10._28_4_ = auVar89._28_4_;
              goto LAB_002e3339;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar93._4_4_ = uVar1;
              auVar93._0_4_ = uVar1;
              auVar93._8_4_ = uVar1;
              auVar93._12_4_ = uVar1;
              auVar93._16_4_ = uVar1;
              auVar93._20_4_ = uVar1;
              auVar93._24_4_ = uVar1;
              auVar93._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar188._4_4_ = uVar1;
              auVar188._0_4_ = uVar1;
              auVar188._8_4_ = uVar1;
              auVar188._12_4_ = uVar1;
              auVar188._16_4_ = uVar1;
              auVar188._20_4_ = uVar1;
              auVar188._24_4_ = uVar1;
              auVar188._28_4_ = uVar1;
              in_ZMM1 = ZEXT3264(auVar188);
              auVar89 = vmaxps_avx(_local_118,auVar93);
              auVar96 = vminps_avx(auVar89,auVar188);
              break;
            case 4:
              auVar94._0_8_ = local_118 ^ 0x8000000080000000;
              auVar94._8_4_ = -fVar108;
              auVar94._12_4_ = -fVar44;
              auVar94._16_4_ = -fVar221;
              auVar94._20_4_ = -fVar109;
              auVar94._24_4_ = -fVar110;
              auVar94._28_4_ = local_118._28_4_ ^ 0x80000000;
              auVar189._8_4_ = 0x42b0c0a5;
              auVar189._0_8_ = 0x42b0c0a542b0c0a5;
              auVar189._12_4_ = 0x42b0c0a5;
              auVar189._16_4_ = 0x42b0c0a5;
              auVar189._20_4_ = 0x42b0c0a5;
              auVar189._24_4_ = 0x42b0c0a5;
              auVar189._28_4_ = 0x42b0c0a5;
              auVar89 = vminps_avx(auVar94,auVar189);
              auVar190._8_4_ = 0xc2b0c0a5;
              auVar190._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar190._12_4_ = 0xc2b0c0a5;
              auVar190._16_4_ = 0xc2b0c0a5;
              auVar190._20_4_ = 0xc2b0c0a5;
              auVar190._24_4_ = 0xc2b0c0a5;
              auVar190._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar89,auVar190);
              auVar191._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
              auVar191._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
              auVar191._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
              auVar191._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
              auVar191._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
              auVar191._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
              auVar191._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
              auVar191._28_4_ = 0x3ff8aa3b;
              auVar179 = vroundps_avx(auVar191,1);
              auVar89 = vcmpps_avx(auVar191,auVar179,1);
              auVar279._8_4_ = 0x3f800000;
              auVar279._0_8_ = 0x3f8000003f800000;
              auVar279._12_4_ = 0x3f800000;
              auVar279._16_4_ = 0x3f800000;
              auVar279._20_4_ = 0x3f800000;
              auVar279._24_4_ = 0x3f800000;
              auVar279._28_4_ = 0x3f800000;
              auVar89 = vandps_avx(auVar89,auVar279);
              auVar89 = vsubps_avx(auVar179,auVar89);
              fVar43 = auVar90._0_4_ + auVar89._0_4_ * -0.6931472;
              fVar107 = auVar90._4_4_ + auVar89._4_4_ * -0.6931472;
              fVar108 = auVar90._8_4_ + auVar89._8_4_ * -0.6931472;
              fVar44 = auVar90._12_4_ + auVar89._12_4_ * -0.6931472;
              fVar221 = auVar90._16_4_ + auVar89._16_4_ * -0.6931472;
              fVar109 = auVar90._20_4_ + auVar89._20_4_ * -0.6931472;
              fVar110 = auVar90._24_4_ + auVar89._24_4_ * -0.6931472;
              auVar117._0_4_ = (int)auVar89._0_4_;
              auVar117._4_4_ = (int)auVar89._4_4_;
              auVar117._8_4_ = (int)auVar89._8_4_;
              auVar117._12_4_ = (int)auVar89._12_4_;
              auVar192._16_4_ = (int)auVar89._16_4_;
              auVar192._0_16_ = auVar117;
              auVar192._20_4_ = (int)auVar89._20_4_;
              auVar192._24_4_ = (int)auVar89._24_4_;
              auVar192._28_4_ = (int)auVar89._28_4_;
              auVar222 = vpslld_avx(auVar117,0x17);
              auVar113 = vpslld_avx(auVar192._16_16_,0x17);
              auVar251._8_4_ = 0x3f800000;
              auVar251._0_8_ = 0x3f8000003f800000;
              auVar251._12_4_ = 0x3f800000;
              auVar113 = vpaddd_avx(auVar113,auVar251);
              auVar222 = vpaddd_avx(auVar222,auVar251);
              auVar95._0_4_ =
                   (fVar43 + 1.0 +
                   fVar43 * fVar43 *
                   (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                     0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar222._0_4_ + 1.0;
              auVar95._4_4_ =
                   (fVar107 + 1.0 +
                   fVar107 * fVar107 *
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar222._4_4_ + 1.0;
              auVar95._8_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar222._8_4_ + 1.0;
              auVar95._12_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar222._12_4_ + 1.0;
              auVar95._16_4_ =
                   (fVar221 + 1.0 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar95._20_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar95._24_4_ =
                   (fVar110 + 1.0 +
                   fVar110 * fVar110 *
                   (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110 +
                     0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar95._28_4_ = auVar90._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
              auVar10 = vrcpps_avx(auVar95);
              auVar20._4_4_ = auVar95._4_4_ * auVar10._4_4_;
              auVar20._0_4_ = auVar95._0_4_ * auVar10._0_4_;
              auVar20._8_4_ = auVar95._8_4_ * auVar10._8_4_;
              auVar20._12_4_ = auVar95._12_4_ * auVar10._12_4_;
              auVar20._16_4_ = auVar95._16_4_ * auVar10._16_4_;
              auVar20._20_4_ = auVar95._20_4_ * auVar10._20_4_;
              auVar20._24_4_ = auVar95._24_4_ * auVar10._24_4_;
              auVar20._28_4_ = auVar95._28_4_;
              auVar89 = vsubps_avx(auVar279,auVar20);
              auVar97._4_4_ = auVar10._4_4_ * auVar89._4_4_;
              auVar97._0_4_ = auVar10._0_4_ * auVar89._0_4_;
              auVar97._8_4_ = auVar10._8_4_ * auVar89._8_4_;
              auVar97._12_4_ = auVar10._12_4_ * auVar89._12_4_;
              auVar97._16_4_ = auVar10._16_4_ * auVar89._16_4_;
              auVar97._20_4_ = auVar10._20_4_ * auVar89._20_4_;
              auVar97._24_4_ = auVar10._24_4_ * auVar89._24_4_;
              auVar97._28_4_ = auVar89._28_4_;
LAB_002e3339:
              in_ZMM1 = ZEXT3264(auVar10);
              auVar96._0_4_ = auVar10._0_4_ + auVar97._0_4_;
              auVar96._4_4_ = auVar10._4_4_ + auVar97._4_4_;
              auVar96._8_4_ = auVar10._8_4_ + auVar97._8_4_;
              auVar96._12_4_ = auVar10._12_4_ + auVar97._12_4_;
              auVar96._16_4_ = auVar10._16_4_ + auVar97._16_4_;
              auVar96._20_4_ = auVar10._20_4_ + auVar97._20_4_;
              auVar96._24_4_ = auVar10._24_4_ + auVar97._24_4_;
              auVar96._28_4_ = auVar10._28_4_ + auVar97._28_4_;
              break;
            case 5:
              auVar288._8_4_ = 0x42b0c0a5;
              auVar288._0_8_ = 0x42b0c0a542b0c0a5;
              auVar288._12_4_ = 0x42b0c0a5;
              auVar288._16_4_ = 0x42b0c0a5;
              auVar288._20_4_ = 0x42b0c0a5;
              auVar288._24_4_ = 0x42b0c0a5;
              auVar288._28_4_ = 0x42b0c0a5;
              auVar89 = vminps_avx(_local_118,auVar288);
              auVar294._8_4_ = 0xc2b0c0a5;
              auVar294._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar294._12_4_ = 0xc2b0c0a5;
              auVar294._16_4_ = 0xc2b0c0a5;
              auVar294._20_4_ = 0xc2b0c0a5;
              auVar294._24_4_ = 0xc2b0c0a5;
              auVar294._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar89,auVar294);
              auVar300._8_4_ = 0x3f000000;
              auVar300._0_8_ = 0x3f0000003f000000;
              auVar300._12_4_ = 0x3f000000;
              auVar300._16_4_ = 0x3f000000;
              auVar300._20_4_ = 0x3f000000;
              auVar300._24_4_ = 0x3f000000;
              auVar300._28_4_ = 0x3f000000;
              auVar180._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
              auVar180._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
              auVar180._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
              auVar180._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
              auVar180._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
              auVar180._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
              auVar180._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
              auVar180._28_4_ = in_ZMM1._28_4_ + 0.5;
              auVar179 = vroundps_avx(auVar180,1);
              auVar89 = vcmpps_avx(auVar180,auVar179,1);
              auVar306._8_4_ = 0x3f800000;
              auVar306._0_8_ = 0x3f8000003f800000;
              auVar306._12_4_ = 0x3f800000;
              auVar306._16_4_ = 0x3f800000;
              auVar306._20_4_ = 0x3f800000;
              auVar306._24_4_ = 0x3f800000;
              auVar306._28_4_ = 0x3f800000;
              auVar89 = vandps_avx(auVar306,auVar89);
              auVar89 = vsubps_avx(auVar179,auVar89);
              auVar16._4_4_ = auVar89._4_4_ * 0.6931472;
              auVar16._0_4_ = auVar89._0_4_ * 0.6931472;
              auVar16._8_4_ = auVar89._8_4_ * 0.6931472;
              auVar16._12_4_ = auVar89._12_4_ * 0.6931472;
              auVar16._16_4_ = auVar89._16_4_ * 0.6931472;
              auVar16._20_4_ = auVar89._20_4_ * 0.6931472;
              auVar16._24_4_ = auVar89._24_4_ * 0.6931472;
              auVar16._28_4_ = auVar179._28_4_;
              auVar90 = vsubps_avx(auVar90,auVar16);
              fVar111 = auVar90._0_4_;
              fVar112 = auVar90._4_4_;
              fVar208 = auVar90._8_4_;
              fVar210 = auVar90._12_4_;
              fVar212 = auVar90._16_4_;
              fVar214 = auVar90._20_4_;
              fVar216 = auVar90._24_4_;
              auVar115._0_4_ = (int)auVar89._0_4_;
              auVar115._4_4_ = (int)auVar89._4_4_;
              auVar115._8_4_ = (int)auVar89._8_4_;
              auVar115._12_4_ = (int)auVar89._12_4_;
              auVar181._16_4_ = (int)auVar89._16_4_;
              auVar181._0_16_ = auVar115;
              auVar181._20_4_ = (int)auVar89._20_4_;
              auVar181._24_4_ = (int)auVar89._24_4_;
              auVar181._28_4_ = (int)auVar89._28_4_;
              auVar222 = vpslld_avx(auVar115,0x17);
              auVar113 = vpslld_avx(auVar181._16_16_,0x17);
              auVar282._8_4_ = 0x3f800000;
              auVar282._0_8_ = 0x3f8000003f800000;
              auVar282._12_4_ = 0x3f800000;
              auVar113 = vpaddd_avx(auVar113,auVar282);
              auVar222 = vpaddd_avx(auVar222,auVar282);
              auVar91._0_4_ =
                   (fVar111 + 1.0 +
                   fVar111 * fVar111 *
                   (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
                     0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar222._0_4_ + 1.0;
              auVar91._4_4_ =
                   (fVar112 + 1.0 +
                   fVar112 * fVar112 *
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                     0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5)) * auVar222._4_4_ + 1.0;
              auVar91._8_4_ =
                   (fVar208 + 1.0 +
                   fVar208 * fVar208 *
                   (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                     0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5)) * auVar222._8_4_ + 1.0;
              auVar91._12_4_ =
                   (fVar210 + 1.0 +
                   fVar210 * fVar210 *
                   (((((fVar210 * 0.00019875691 + 0.0013981999) * fVar210 + 0.008333452) * fVar210 +
                     0.041665796) * fVar210 + 0.16666666) * fVar210 + 0.5)) * auVar222._12_4_ + 1.0;
              auVar91._16_4_ =
                   (fVar212 + 1.0 +
                   fVar212 * fVar212 *
                   (((((fVar212 * 0.00019875691 + 0.0013981999) * fVar212 + 0.008333452) * fVar212 +
                     0.041665796) * fVar212 + 0.16666666) * fVar212 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar91._20_4_ =
                   (fVar214 + 1.0 +
                   fVar214 * fVar214 *
                   (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) * fVar214 +
                     0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar91._24_4_ =
                   (fVar216 + 1.0 +
                   fVar216 * fVar216 *
                   (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216 +
                     0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar91._28_4_ = auVar90._28_4_ + 1.0 + auVar179._28_4_ + 1.0;
              auVar182._8_4_ = 0x800000;
              auVar182._0_8_ = 0x80000000800000;
              auVar182._12_4_ = 0x800000;
              auVar182._16_4_ = 0x800000;
              auVar182._20_4_ = 0x800000;
              auVar182._24_4_ = 0x800000;
              auVar182._28_4_ = 0x800000;
              auVar179 = vmaxps_avx(auVar91,auVar182);
              auVar113 = vpsrld_avx(auVar179._16_16_,0x17);
              auVar183._8_4_ = 0x807fffff;
              auVar183._0_8_ = 0x807fffff807fffff;
              auVar183._12_4_ = 0x807fffff;
              auVar183._16_4_ = 0x807fffff;
              auVar183._20_4_ = 0x807fffff;
              auVar183._24_4_ = 0x807fffff;
              auVar183._28_4_ = 0x807fffff;
              auVar89 = vandps_avx(auVar179,auVar183);
              auVar8 = vorps_avx(auVar300,auVar89);
              auVar269._8_4_ = 0x3f3504f3;
              auVar269._0_8_ = 0x3f3504f33f3504f3;
              auVar269._12_4_ = 0x3f3504f3;
              auVar269._16_4_ = 0x3f3504f3;
              auVar269._20_4_ = 0x3f3504f3;
              auVar269._24_4_ = 0x3f3504f3;
              auVar269._28_4_ = 0x3f3504f3;
              auVar90 = vcmpps_avx(auVar269,auVar8,2);
              auVar89 = vandnps_avx(auVar90,auVar8);
              fVar111 = auVar8._0_4_ + -1.0 + auVar89._0_4_;
              fVar112 = auVar8._4_4_ + -1.0 + auVar89._4_4_;
              fVar208 = auVar8._8_4_ + -1.0 + auVar89._8_4_;
              fVar210 = auVar8._12_4_ + -1.0 + auVar89._12_4_;
              fVar212 = auVar8._16_4_ + -1.0 + auVar89._16_4_;
              fVar214 = auVar8._20_4_ + -1.0 + auVar89._20_4_;
              fVar216 = auVar8._24_4_ + -1.0 + auVar89._24_4_;
              auVar113 = vpsubd_avx(auVar113,auVar90._16_16_);
              auVar222 = vpsrld_avx(auVar179._0_16_,0x17);
              auVar273._8_4_ = 0xffffff81;
              auVar273._0_8_ = 0xffffff81ffffff81;
              auVar273._12_4_ = 0xffffff81;
              auVar113 = vpaddd_avx(auVar113,auVar273);
              auVar222 = vpsubd_avx(auVar222,auVar90._0_16_);
              auVar222 = vpaddd_avx(auVar222,auVar273);
              auVar246._16_16_ = auVar113;
              auVar246._0_16_ = auVar222;
              auVar90 = vcmpps_avx(auVar91,_DAT_002f0280,2);
              auVar179 = vcvtdq2ps_avx(auVar246);
              auVar17._4_4_ =
                   (auVar179._4_4_ * 0.6931472 + fVar112 +
                   fVar112 * fVar112 *
                   (((((((((fVar112 * 0.070376836 + -0.1151461) * fVar112 + 0.116769984) * fVar112 +
                         -0.12420141) * fVar112 + 0.14249323) * fVar112 + -0.16668057) * fVar112 +
                      0.20000714) * fVar112 + -0.24999994) * fVar112 + 0.3333333) * fVar112 + -0.5))
                   * -2.0;
              auVar17._0_4_ =
                   (auVar179._0_4_ * 0.6931472 + fVar111 +
                   fVar111 * fVar111 *
                   (((((((((fVar111 * 0.070376836 + -0.1151461) * fVar111 + 0.116769984) * fVar111 +
                         -0.12420141) * fVar111 + 0.14249323) * fVar111 + -0.16668057) * fVar111 +
                      0.20000714) * fVar111 + -0.24999994) * fVar111 + 0.3333333) * fVar111 + -0.5))
                   * -2.0;
              auVar17._8_4_ =
                   (auVar179._8_4_ * 0.6931472 + fVar208 +
                   fVar208 * fVar208 *
                   (((((((((fVar208 * 0.070376836 + -0.1151461) * fVar208 + 0.116769984) * fVar208 +
                         -0.12420141) * fVar208 + 0.14249323) * fVar208 + -0.16668057) * fVar208 +
                      0.20000714) * fVar208 + -0.24999994) * fVar208 + 0.3333333) * fVar208 + -0.5))
                   * -2.0;
              auVar17._12_4_ =
                   (auVar179._12_4_ * 0.6931472 + fVar210 +
                   fVar210 * fVar210 *
                   (((((((((fVar210 * 0.070376836 + -0.1151461) * fVar210 + 0.116769984) * fVar210 +
                         -0.12420141) * fVar210 + 0.14249323) * fVar210 + -0.16668057) * fVar210 +
                      0.20000714) * fVar210 + -0.24999994) * fVar210 + 0.3333333) * fVar210 + -0.5))
                   * -2.0;
              auVar17._16_4_ =
                   (auVar179._16_4_ * 0.6931472 + fVar212 +
                   fVar212 * fVar212 *
                   (((((((((fVar212 * 0.070376836 + -0.1151461) * fVar212 + 0.116769984) * fVar212 +
                         -0.12420141) * fVar212 + 0.14249323) * fVar212 + -0.16668057) * fVar212 +
                      0.20000714) * fVar212 + -0.24999994) * fVar212 + 0.3333333) * fVar212 + -0.5))
                   * -2.0;
              auVar17._20_4_ =
                   (auVar179._20_4_ * 0.6931472 + fVar214 +
                   fVar214 * fVar214 *
                   (((((((((fVar214 * 0.070376836 + -0.1151461) * fVar214 + 0.116769984) * fVar214 +
                         -0.12420141) * fVar214 + 0.14249323) * fVar214 + -0.16668057) * fVar214 +
                      0.20000714) * fVar214 + -0.24999994) * fVar214 + 0.3333333) * fVar214 + -0.5))
                   * -2.0;
              auVar17._24_4_ =
                   (auVar179._24_4_ * 0.6931472 + fVar216 +
                   fVar216 * fVar216 *
                   (((((((((fVar216 * 0.070376836 + -0.1151461) * fVar216 + 0.116769984) * fVar216 +
                         -0.12420141) * fVar216 + 0.14249323) * fVar216 + -0.16668057) * fVar216 +
                      0.20000714) * fVar216 + -0.24999994) * fVar216 + 0.3333333) * fVar216 + -0.5))
                   * -2.0;
              auVar17._28_4_ = auVar179._28_4_ + auVar8._28_4_ + -1.0 + auVar89._28_4_ + 0.0;
              auVar247._8_4_ = 0x7fffffff;
              auVar247._0_8_ = 0x7fffffff7fffffff;
              auVar247._12_4_ = 0x7fffffff;
              auVar247._16_4_ = 0x7fffffff;
              auVar247._20_4_ = 0x7fffffff;
              auVar247._24_4_ = 0x7fffffff;
              auVar247._28_4_ = 0x7fffffff;
              auVar89 = vblendvps_avx(auVar17,auVar247,auVar90);
              auVar184._8_4_ = 0x42b0c0a5;
              auVar184._0_8_ = 0x42b0c0a542b0c0a5;
              auVar184._12_4_ = 0x42b0c0a5;
              auVar184._16_4_ = 0x42b0c0a5;
              auVar184._20_4_ = 0x42b0c0a5;
              auVar184._24_4_ = 0x42b0c0a5;
              auVar184._28_4_ = 0x42b0c0a5;
              auVar89 = vminps_avx(auVar89,auVar184);
              auVar185._8_4_ = 0xc2b0c0a5;
              auVar185._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar185._12_4_ = 0xc2b0c0a5;
              auVar185._16_4_ = 0xc2b0c0a5;
              auVar185._20_4_ = 0xc2b0c0a5;
              auVar185._24_4_ = 0xc2b0c0a5;
              auVar185._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar89,auVar185);
              auVar186._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
              auVar186._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
              auVar186._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
              auVar186._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
              auVar186._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
              auVar186._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
              auVar186._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
              auVar186._28_4_ = 0x3ff8aa3b;
              auVar179 = vroundps_avx(auVar186,1);
              auVar89 = vcmpps_avx(auVar186,auVar179,1);
              auVar89 = vandps_avx(auVar306,auVar89);
              auVar89 = vsubps_avx(auVar179,auVar89);
              auVar18._4_4_ = auVar89._4_4_ * 0.6931472;
              auVar18._0_4_ = auVar89._0_4_ * 0.6931472;
              auVar18._8_4_ = auVar89._8_4_ * 0.6931472;
              auVar18._12_4_ = auVar89._12_4_ * 0.6931472;
              auVar18._16_4_ = auVar89._16_4_ * 0.6931472;
              auVar18._20_4_ = auVar89._20_4_ * 0.6931472;
              auVar18._24_4_ = auVar89._24_4_ * 0.6931472;
              auVar18._28_4_ = auVar179._28_4_;
              auVar90 = vsubps_avx(auVar90,auVar18);
              fVar111 = auVar90._0_4_;
              fVar112 = auVar90._4_4_;
              fVar208 = auVar90._8_4_;
              fVar210 = auVar90._12_4_;
              fVar212 = auVar90._16_4_;
              fVar214 = auVar90._20_4_;
              fVar216 = auVar90._24_4_;
              auVar116._0_4_ = (int)auVar89._0_4_;
              auVar116._4_4_ = (int)auVar89._4_4_;
              auVar116._8_4_ = (int)auVar89._8_4_;
              auVar116._12_4_ = (int)auVar89._12_4_;
              auVar187._16_4_ = (int)auVar89._16_4_;
              auVar187._0_16_ = auVar116;
              auVar187._20_4_ = (int)auVar89._20_4_;
              auVar187._24_4_ = (int)auVar89._24_4_;
              auVar187._28_4_ = (int)auVar89._28_4_;
              auVar222 = vpslld_avx(auVar116,0x17);
              auVar113 = vpslld_avx(auVar187._16_16_,0x17);
              auVar113 = vpaddd_avx(auVar113,auVar282);
              auVar222 = vpaddd_avx(auVar222,auVar282);
              auVar92._0_4_ =
                   (fVar111 + 1.0 +
                   fVar111 * fVar111 *
                   (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
                     0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar222._0_4_ + 1.0;
              auVar92._4_4_ =
                   (fVar112 + 1.0 +
                   fVar112 * fVar112 *
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                     0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5)) * auVar222._4_4_ + 1.0;
              auVar92._8_4_ =
                   (fVar208 + 1.0 +
                   fVar208 * fVar208 *
                   (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                     0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5)) * auVar222._8_4_ + 1.0;
              auVar92._12_4_ =
                   (fVar210 + 1.0 +
                   fVar210 * fVar210 *
                   (((((fVar210 * 0.00019875691 + 0.0013981999) * fVar210 + 0.008333452) * fVar210 +
                     0.041665796) * fVar210 + 0.16666666) * fVar210 + 0.5)) * auVar222._12_4_ + 1.0;
              auVar92._16_4_ =
                   (fVar212 + 1.0 +
                   fVar212 * fVar212 *
                   (((((fVar212 * 0.00019875691 + 0.0013981999) * fVar212 + 0.008333452) * fVar212 +
                     0.041665796) * fVar212 + 0.16666666) * fVar212 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar92._20_4_ =
                   (fVar214 + 1.0 +
                   fVar214 * fVar214 *
                   (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) * fVar214 +
                     0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar92._24_4_ =
                   (fVar216 + 1.0 +
                   fVar216 * fVar216 *
                   (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216 +
                     0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar92._28_4_ = auVar90._28_4_ + 1.0 + auVar179._28_4_ + 1.0;
              auVar89 = vrcpps_avx(auVar92);
              fVar111 = auVar89._0_4_;
              fVar112 = auVar89._4_4_;
              fVar208 = auVar89._8_4_;
              fVar210 = auVar89._12_4_;
              fVar212 = auVar89._16_4_;
              fVar214 = auVar89._20_4_;
              fVar216 = auVar89._24_4_;
              auVar19._4_4_ = auVar92._4_4_ * (fVar112 + fVar112);
              auVar19._0_4_ = auVar92._0_4_ * (fVar111 + fVar111);
              auVar19._8_4_ = auVar92._8_4_ * (fVar208 + fVar208);
              auVar19._12_4_ = auVar92._12_4_ * (fVar210 + fVar210);
              auVar19._16_4_ = auVar92._16_4_ * (fVar212 + fVar212);
              auVar19._20_4_ = auVar92._20_4_ * (fVar214 + fVar214);
              auVar19._24_4_ = auVar92._24_4_ * (fVar216 + fVar216);
              auVar19._28_4_ = auVar92._28_4_;
              auVar266._8_4_ = 0x40000000;
              auVar266._0_8_ = 0x4000000040000000;
              auVar266._12_4_ = 0x40000000;
              auVar266._16_4_ = 0x40000000;
              auVar266._20_4_ = 0x40000000;
              auVar266._24_4_ = 0x40000000;
              auVar266._28_4_ = 0x40000000;
              auVar90 = vsubps_avx(auVar266,auVar19);
              fVar218 = fVar111 + fVar111 + -1.0;
              fVar209 = fVar112 + fVar112 + -1.0;
              fVar211 = fVar208 + fVar208 + -1.0;
              fVar213 = fVar210 + fVar210 + -1.0;
              fVar215 = fVar212 + fVar212 + -1.0;
              fVar217 = fVar214 + fVar214 + -1.0;
              fVar219 = fVar216 + fVar216 + -1.0;
              fVar220 = auVar89._28_4_ + auVar89._28_4_ + -1.0;
              in_ZMM1 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar219,CONCAT420(fVar217,CONCAT416(
                                                  fVar215,CONCAT412(fVar213,CONCAT48(fVar211,
                                                  CONCAT44(fVar209,fVar218))))))));
              auVar96._4_4_ = (fVar209 + fVar112 * auVar90._4_4_) * fVar107;
              auVar96._0_4_ = (fVar218 + fVar111 * auVar90._0_4_) * fVar43;
              auVar96._8_4_ = (fVar211 + fVar208 * auVar90._8_4_) * fVar108;
              auVar96._12_4_ = (fVar213 + fVar210 * auVar90._12_4_) * fVar44;
              auVar96._16_4_ = (fVar215 + fVar212 * auVar90._16_4_) * fVar221;
              auVar96._20_4_ = (fVar217 + fVar214 * auVar90._20_4_) * fVar109;
              auVar96._24_4_ = (fVar219 + fVar216 * auVar90._24_4_) * fVar110;
              auVar96._28_4_ = fVar220 + auVar90._28_4_;
              break;
            case 6:
              fVar111 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar112 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar98._0_4_ = fVar111 * fVar43 + fVar112;
              auVar98._4_4_ = fVar111 * fVar107 + fVar112;
              auVar98._8_4_ = fVar111 * fVar108 + fVar112;
              auVar98._12_4_ = fVar111 * fVar44 + fVar112;
              auVar98._16_4_ = fVar111 * fVar221 + fVar112;
              auVar98._20_4_ = fVar111 * fVar109 + fVar112;
              auVar98._24_4_ = fVar111 * fVar110 + fVar112;
              auVar98._28_4_ = fVar111 + fVar112;
              auVar89 = vmaxps_avx(auVar98,ZEXT1632(auVar113));
              auVar193._8_4_ = 0x3f800000;
              auVar193._0_8_ = 0x3f8000003f800000;
              auVar193._12_4_ = 0x3f800000;
              auVar193._16_4_ = 0x3f800000;
              auVar193._20_4_ = 0x3f800000;
              auVar193._24_4_ = 0x3f800000;
              auVar193._28_4_ = 0x3f800000;
              in_ZMM1 = ZEXT3264(auVar193);
              auVar89 = vminps_avx(auVar89,auVar193);
              auVar96._4_4_ = auVar89._4_4_ * fVar107;
              auVar96._0_4_ = auVar89._0_4_ * fVar43;
              auVar96._8_4_ = auVar89._8_4_ * fVar108;
              auVar96._12_4_ = auVar89._12_4_ * fVar44;
              auVar96._16_4_ = auVar89._16_4_ * fVar221;
              auVar96._20_4_ = auVar89._20_4_ * fVar109;
              auVar96._24_4_ = auVar89._24_4_ * fVar110;
              auVar96._28_4_ = (float)auVar89._28_4_;
            }
LAB_002e3374:
            *pauVar30 = auVar96;
            pauVar30 = pauVar30 + 1;
          }
        }
      }
      if ((iVar2 == 4) && (_elempack == 8)) {
        uVar40 = 0;
        if (0 < iVar26) {
          uVar40 = (ulong)(uint)iVar26;
        }
        uVar33 = 0;
        if (0 < iVar39) {
          uVar33 = uVar27;
        }
        for (uVar32 = 0; uVar32 != uVar33; uVar32 = uVar32 + 1) {
          pauVar30 = (undefined1 (*) [32])
                     ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
          for (iVar35 = 0; iVar35 <= iVar29; iVar35 = iVar35 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx[-3]) == 0) {
              _local_118 = ZEXT1632(ZEXT816(0) << 0x40);
            }
            else {
              _local_118 = *(undefined1 (*) [32])
                            (*(long *)(&this->field_0x190 +
                                      (long)this->_vptr_Convolution1D_x86_avx[-3]) + uVar32 * 0x20);
            }
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar32);
            pfVar34 = (float *)local_80.data;
            Mat::~Mat(&local_80);
            for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar37 = (float *)((long)bottom_blob_bordered.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar35 * 4) * 4
                                 + (long)bottom_blob_bordered.w * bottom_blob_bordered.elemsize *
                                   uVar36);
              iVar38 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar38 = 0;
              }
              while (bVar42 = iVar38 != 0, iVar38 = iVar38 + -1, bVar42) {
                fVar43 = *pfVar37;
                fVar107 = pfVar37[1];
                fVar108 = pfVar37[2];
                fVar44 = pfVar37[3];
                fVar221 = fVar107 + fVar108;
                in_ZMM1 = ZEXT3264(CONCAT428(fVar221,CONCAT424(fVar44 * pfVar34[0x1e],
                                                               CONCAT420(fVar44 * pfVar34[0x1d],
                                                                         CONCAT416(fVar44 * pfVar34[
                                                  0x1c],CONCAT412(fVar44 * pfVar34[0x1b],
                                                                  CONCAT48(fVar44 * pfVar34[0x1a],
                                                                           CONCAT44(fVar44 * pfVar34
                                                  [0x19],fVar44 * pfVar34[0x18]))))))));
                local_118._0_4_ =
                     fVar43 * *pfVar34 + (float)local_118._0_4_ +
                     fVar107 * pfVar34[8] + fVar108 * pfVar34[0x10] + fVar44 * pfVar34[0x18];
                local_118._4_4_ =
                     fVar43 * pfVar34[1] + (float)local_118._4_4_ +
                     fVar107 * pfVar34[9] + fVar108 * pfVar34[0x11] + fVar44 * pfVar34[0x19];
                fStack_110 = fVar43 * pfVar34[2] + fStack_110 +
                             fVar107 * pfVar34[10] + fVar108 * pfVar34[0x12] +
                             fVar44 * pfVar34[0x1a];
                fStack_10c = fVar43 * pfVar34[3] + fStack_10c +
                             fVar107 * pfVar34[0xb] + fVar108 * pfVar34[0x13] +
                             fVar44 * pfVar34[0x1b];
                fStack_108 = fVar43 * pfVar34[4] + fStack_108 +
                             fVar107 * pfVar34[0xc] + fVar108 * pfVar34[0x14] +
                             fVar44 * pfVar34[0x1c];
                fStack_104 = fVar43 * pfVar34[5] + fStack_104 +
                             fVar107 * pfVar34[0xd] + fVar108 * pfVar34[0x15] +
                             fVar44 * pfVar34[0x1d];
                fStack_100 = fVar43 * pfVar34[6] + fStack_100 +
                             fVar107 * pfVar34[0xe] + fVar108 * pfVar34[0x16] +
                             fVar44 * pfVar34[0x1e];
                fStack_fc = fVar43 + fStack_fc + fVar221 + fVar221;
                pfVar37 = pfVar37 + (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * 4;
                pfVar34 = pfVar34 + 0x20;
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
            auVar105 = _local_118;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto switchD_002e359e_caseD_1;
            auVar113 = ZEXT816(0) << 0x40;
            auVar105 = vmaxps_avx(_local_118,ZEXT1632(auVar113));
            fVar43 = local_118._0_4_;
            fVar107 = local_118._4_4_;
            fVar108 = local_118._8_4_;
            fVar44 = local_118._12_4_;
            fVar221 = local_118._16_4_;
            fVar109 = local_118._20_4_;
            fVar110 = local_118._24_4_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar89 = vminps_avx(_local_118,ZEXT1632(auVar113));
              fVar43 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar11._4_4_ = fVar43 * auVar89._4_4_;
              auVar11._0_4_ = fVar43 * auVar89._0_4_;
              auVar11._8_4_ = fVar43 * auVar89._8_4_;
              auVar11._12_4_ = fVar43 * auVar89._12_4_;
              auVar11._16_4_ = fVar43 * auVar89._16_4_;
              auVar11._20_4_ = fVar43 * auVar89._20_4_;
              auVar11._24_4_ = fVar43 * auVar89._24_4_;
              auVar11._28_4_ = auVar89._28_4_;
              goto LAB_002e3a1c;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar101._4_4_ = uVar1;
              auVar101._0_4_ = uVar1;
              auVar101._8_4_ = uVar1;
              auVar101._12_4_ = uVar1;
              auVar101._16_4_ = uVar1;
              auVar101._20_4_ = uVar1;
              auVar101._24_4_ = uVar1;
              auVar101._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar202._4_4_ = uVar1;
              auVar202._0_4_ = uVar1;
              auVar202._8_4_ = uVar1;
              auVar202._12_4_ = uVar1;
              auVar202._16_4_ = uVar1;
              auVar202._20_4_ = uVar1;
              auVar202._24_4_ = uVar1;
              auVar202._28_4_ = uVar1;
              in_ZMM1 = ZEXT3264(auVar202);
              auVar89 = vmaxps_avx(_local_118,auVar101);
              auVar105 = vminps_avx(auVar89,auVar202);
              break;
            case 4:
              auVar102._0_8_ = local_118 ^ 0x8000000080000000;
              auVar102._8_4_ = -fVar108;
              auVar102._12_4_ = -fVar44;
              auVar102._16_4_ = -fVar221;
              auVar102._20_4_ = -fVar109;
              auVar102._24_4_ = -fVar110;
              auVar102._28_4_ = local_118._28_4_ ^ 0x80000000;
              auVar203._8_4_ = 0x42b0c0a5;
              auVar203._0_8_ = 0x42b0c0a542b0c0a5;
              auVar203._12_4_ = 0x42b0c0a5;
              auVar203._16_4_ = 0x42b0c0a5;
              auVar203._20_4_ = 0x42b0c0a5;
              auVar203._24_4_ = 0x42b0c0a5;
              auVar203._28_4_ = 0x42b0c0a5;
              auVar89 = vminps_avx(auVar102,auVar203);
              auVar204._8_4_ = 0xc2b0c0a5;
              auVar204._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar204._12_4_ = 0xc2b0c0a5;
              auVar204._16_4_ = 0xc2b0c0a5;
              auVar204._20_4_ = 0xc2b0c0a5;
              auVar204._24_4_ = 0xc2b0c0a5;
              auVar204._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar89,auVar204);
              auVar205._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
              auVar205._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
              auVar205._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
              auVar205._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
              auVar205._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
              auVar205._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
              auVar205._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
              auVar205._28_4_ = 0x3ff8aa3b;
              auVar179 = vroundps_avx(auVar205,1);
              auVar89 = vcmpps_avx(auVar205,auVar179,1);
              auVar280._8_4_ = 0x3f800000;
              auVar280._0_8_ = 0x3f8000003f800000;
              auVar280._12_4_ = 0x3f800000;
              auVar280._16_4_ = 0x3f800000;
              auVar280._20_4_ = 0x3f800000;
              auVar280._24_4_ = 0x3f800000;
              auVar280._28_4_ = 0x3f800000;
              auVar89 = vandps_avx(auVar89,auVar280);
              auVar89 = vsubps_avx(auVar179,auVar89);
              fVar43 = auVar90._0_4_ + auVar89._0_4_ * -0.6931472;
              fVar107 = auVar90._4_4_ + auVar89._4_4_ * -0.6931472;
              fVar108 = auVar90._8_4_ + auVar89._8_4_ * -0.6931472;
              fVar44 = auVar90._12_4_ + auVar89._12_4_ * -0.6931472;
              fVar221 = auVar90._16_4_ + auVar89._16_4_ * -0.6931472;
              fVar109 = auVar90._20_4_ + auVar89._20_4_ * -0.6931472;
              fVar110 = auVar90._24_4_ + auVar89._24_4_ * -0.6931472;
              auVar120._0_4_ = (int)auVar89._0_4_;
              auVar120._4_4_ = (int)auVar89._4_4_;
              auVar120._8_4_ = (int)auVar89._8_4_;
              auVar120._12_4_ = (int)auVar89._12_4_;
              auVar206._16_4_ = (int)auVar89._16_4_;
              auVar206._0_16_ = auVar120;
              auVar206._20_4_ = (int)auVar89._20_4_;
              auVar206._24_4_ = (int)auVar89._24_4_;
              auVar206._28_4_ = (int)auVar89._28_4_;
              auVar222 = vpslld_avx(auVar120,0x17);
              auVar113 = vpslld_avx(auVar206._16_16_,0x17);
              auVar252._8_4_ = 0x3f800000;
              auVar252._0_8_ = 0x3f8000003f800000;
              auVar252._12_4_ = 0x3f800000;
              auVar113 = vpaddd_avx(auVar113,auVar252);
              auVar222 = vpaddd_avx(auVar222,auVar252);
              auVar103._0_4_ =
                   (fVar43 + 1.0 +
                   fVar43 * fVar43 *
                   (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                     0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar222._0_4_ + 1.0;
              auVar103._4_4_ =
                   (fVar107 + 1.0 +
                   fVar107 * fVar107 *
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar222._4_4_ + 1.0;
              auVar103._8_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar222._8_4_ + 1.0;
              auVar103._12_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar222._12_4_ + 1.0;
              auVar103._16_4_ =
                   (fVar221 + 1.0 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar103._20_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar103._24_4_ =
                   (fVar110 + 1.0 +
                   fVar110 * fVar110 *
                   (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110 +
                     0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar103._28_4_ = auVar90._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
              auVar11 = vrcpps_avx(auVar103);
              auVar25._4_4_ = auVar103._4_4_ * auVar11._4_4_;
              auVar25._0_4_ = auVar103._0_4_ * auVar11._0_4_;
              auVar25._8_4_ = auVar103._8_4_ * auVar11._8_4_;
              auVar25._12_4_ = auVar103._12_4_ * auVar11._12_4_;
              auVar25._16_4_ = auVar103._16_4_ * auVar11._16_4_;
              auVar25._20_4_ = auVar103._20_4_ * auVar11._20_4_;
              auVar25._24_4_ = auVar103._24_4_ * auVar11._24_4_;
              auVar25._28_4_ = auVar103._28_4_;
              auVar89 = vsubps_avx(auVar280,auVar25);
              auVar105._4_4_ = auVar11._4_4_ * auVar89._4_4_;
              auVar105._0_4_ = auVar11._0_4_ * auVar89._0_4_;
              auVar105._8_4_ = auVar11._8_4_ * auVar89._8_4_;
              auVar105._12_4_ = auVar11._12_4_ * auVar89._12_4_;
              auVar105._16_4_ = auVar11._16_4_ * auVar89._16_4_;
              auVar105._20_4_ = auVar11._20_4_ * auVar89._20_4_;
              auVar105._24_4_ = auVar11._24_4_ * auVar89._24_4_;
              auVar105._28_4_ = auVar89._28_4_;
LAB_002e3a1c:
              in_ZMM1 = ZEXT3264(auVar11);
              auVar104._0_4_ = auVar11._0_4_ + auVar105._0_4_;
              auVar104._4_4_ = auVar11._4_4_ + auVar105._4_4_;
              auVar104._8_4_ = auVar11._8_4_ + auVar105._8_4_;
              auVar104._12_4_ = auVar11._12_4_ + auVar105._12_4_;
              auVar104._16_4_ = auVar11._16_4_ + auVar105._16_4_;
              auVar104._20_4_ = auVar11._20_4_ + auVar105._20_4_;
              auVar104._24_4_ = auVar11._24_4_ + auVar105._24_4_;
              auVar104._28_4_ = auVar11._28_4_ + auVar105._28_4_;
              auVar105 = auVar104;
              break;
            case 5:
              auVar289._8_4_ = 0x42b0c0a5;
              auVar289._0_8_ = 0x42b0c0a542b0c0a5;
              auVar289._12_4_ = 0x42b0c0a5;
              auVar289._16_4_ = 0x42b0c0a5;
              auVar289._20_4_ = 0x42b0c0a5;
              auVar289._24_4_ = 0x42b0c0a5;
              auVar289._28_4_ = 0x42b0c0a5;
              auVar89 = vminps_avx(_local_118,auVar289);
              auVar295._8_4_ = 0xc2b0c0a5;
              auVar295._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar295._12_4_ = 0xc2b0c0a5;
              auVar295._16_4_ = 0xc2b0c0a5;
              auVar295._20_4_ = 0xc2b0c0a5;
              auVar295._24_4_ = 0xc2b0c0a5;
              auVar295._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar89,auVar295);
              auVar301._8_4_ = 0x3f000000;
              auVar301._0_8_ = 0x3f0000003f000000;
              auVar301._12_4_ = 0x3f000000;
              auVar301._16_4_ = 0x3f000000;
              auVar301._20_4_ = 0x3f000000;
              auVar301._24_4_ = 0x3f000000;
              auVar301._28_4_ = 0x3f000000;
              auVar194._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
              auVar194._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
              auVar194._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
              auVar194._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
              auVar194._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
              auVar194._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
              auVar194._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
              auVar194._28_4_ = in_ZMM1._28_4_ + 0.5;
              auVar179 = vroundps_avx(auVar194,1);
              auVar89 = vcmpps_avx(auVar194,auVar179,1);
              auVar307._8_4_ = 0x3f800000;
              auVar307._0_8_ = 0x3f8000003f800000;
              auVar307._12_4_ = 0x3f800000;
              auVar307._16_4_ = 0x3f800000;
              auVar307._20_4_ = 0x3f800000;
              auVar307._24_4_ = 0x3f800000;
              auVar307._28_4_ = 0x3f800000;
              auVar89 = vandps_avx(auVar307,auVar89);
              auVar89 = vsubps_avx(auVar179,auVar89);
              auVar21._4_4_ = auVar89._4_4_ * 0.6931472;
              auVar21._0_4_ = auVar89._0_4_ * 0.6931472;
              auVar21._8_4_ = auVar89._8_4_ * 0.6931472;
              auVar21._12_4_ = auVar89._12_4_ * 0.6931472;
              auVar21._16_4_ = auVar89._16_4_ * 0.6931472;
              auVar21._20_4_ = auVar89._20_4_ * 0.6931472;
              auVar21._24_4_ = auVar89._24_4_ * 0.6931472;
              auVar21._28_4_ = auVar179._28_4_;
              auVar90 = vsubps_avx(auVar90,auVar21);
              fVar111 = auVar90._0_4_;
              fVar112 = auVar90._4_4_;
              fVar208 = auVar90._8_4_;
              fVar210 = auVar90._12_4_;
              fVar212 = auVar90._16_4_;
              fVar214 = auVar90._20_4_;
              fVar216 = auVar90._24_4_;
              auVar118._0_4_ = (int)auVar89._0_4_;
              auVar118._4_4_ = (int)auVar89._4_4_;
              auVar118._8_4_ = (int)auVar89._8_4_;
              auVar118._12_4_ = (int)auVar89._12_4_;
              auVar195._16_4_ = (int)auVar89._16_4_;
              auVar195._0_16_ = auVar118;
              auVar195._20_4_ = (int)auVar89._20_4_;
              auVar195._24_4_ = (int)auVar89._24_4_;
              auVar195._28_4_ = (int)auVar89._28_4_;
              auVar222 = vpslld_avx(auVar118,0x17);
              auVar113 = vpslld_avx(auVar195._16_16_,0x17);
              auVar283._8_4_ = 0x3f800000;
              auVar283._0_8_ = 0x3f8000003f800000;
              auVar283._12_4_ = 0x3f800000;
              auVar113 = vpaddd_avx(auVar113,auVar283);
              auVar222 = vpaddd_avx(auVar222,auVar283);
              auVar99._0_4_ =
                   (fVar111 + 1.0 +
                   fVar111 * fVar111 *
                   (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
                     0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar222._0_4_ + 1.0;
              auVar99._4_4_ =
                   (fVar112 + 1.0 +
                   fVar112 * fVar112 *
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                     0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5)) * auVar222._4_4_ + 1.0;
              auVar99._8_4_ =
                   (fVar208 + 1.0 +
                   fVar208 * fVar208 *
                   (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                     0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5)) * auVar222._8_4_ + 1.0;
              auVar99._12_4_ =
                   (fVar210 + 1.0 +
                   fVar210 * fVar210 *
                   (((((fVar210 * 0.00019875691 + 0.0013981999) * fVar210 + 0.008333452) * fVar210 +
                     0.041665796) * fVar210 + 0.16666666) * fVar210 + 0.5)) * auVar222._12_4_ + 1.0;
              auVar99._16_4_ =
                   (fVar212 + 1.0 +
                   fVar212 * fVar212 *
                   (((((fVar212 * 0.00019875691 + 0.0013981999) * fVar212 + 0.008333452) * fVar212 +
                     0.041665796) * fVar212 + 0.16666666) * fVar212 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar99._20_4_ =
                   (fVar214 + 1.0 +
                   fVar214 * fVar214 *
                   (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) * fVar214 +
                     0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar99._24_4_ =
                   (fVar216 + 1.0 +
                   fVar216 * fVar216 *
                   (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216 +
                     0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar99._28_4_ = auVar90._28_4_ + 1.0 + auVar179._28_4_ + 1.0;
              auVar196._8_4_ = 0x800000;
              auVar196._0_8_ = 0x80000000800000;
              auVar196._12_4_ = 0x800000;
              auVar196._16_4_ = 0x800000;
              auVar196._20_4_ = 0x800000;
              auVar196._24_4_ = 0x800000;
              auVar196._28_4_ = 0x800000;
              auVar179 = vmaxps_avx(auVar99,auVar196);
              auVar113 = vpsrld_avx(auVar179._16_16_,0x17);
              auVar197._8_4_ = 0x807fffff;
              auVar197._0_8_ = 0x807fffff807fffff;
              auVar197._12_4_ = 0x807fffff;
              auVar197._16_4_ = 0x807fffff;
              auVar197._20_4_ = 0x807fffff;
              auVar197._24_4_ = 0x807fffff;
              auVar197._28_4_ = 0x807fffff;
              auVar89 = vandps_avx(auVar179,auVar197);
              auVar8 = vorps_avx(auVar301,auVar89);
              auVar270._8_4_ = 0x3f3504f3;
              auVar270._0_8_ = 0x3f3504f33f3504f3;
              auVar270._12_4_ = 0x3f3504f3;
              auVar270._16_4_ = 0x3f3504f3;
              auVar270._20_4_ = 0x3f3504f3;
              auVar270._24_4_ = 0x3f3504f3;
              auVar270._28_4_ = 0x3f3504f3;
              auVar90 = vcmpps_avx(auVar270,auVar8,2);
              auVar89 = vandnps_avx(auVar90,auVar8);
              fVar111 = auVar8._0_4_ + -1.0 + auVar89._0_4_;
              fVar112 = auVar8._4_4_ + -1.0 + auVar89._4_4_;
              fVar208 = auVar8._8_4_ + -1.0 + auVar89._8_4_;
              fVar210 = auVar8._12_4_ + -1.0 + auVar89._12_4_;
              fVar212 = auVar8._16_4_ + -1.0 + auVar89._16_4_;
              fVar214 = auVar8._20_4_ + -1.0 + auVar89._20_4_;
              fVar216 = auVar8._24_4_ + -1.0 + auVar89._24_4_;
              auVar113 = vpsubd_avx(auVar113,auVar90._16_16_);
              auVar222 = vpsrld_avx(auVar179._0_16_,0x17);
              auVar274._8_4_ = 0xffffff81;
              auVar274._0_8_ = 0xffffff81ffffff81;
              auVar274._12_4_ = 0xffffff81;
              auVar113 = vpaddd_avx(auVar113,auVar274);
              auVar222 = vpsubd_avx(auVar222,auVar90._0_16_);
              auVar222 = vpaddd_avx(auVar222,auVar274);
              auVar248._16_16_ = auVar113;
              auVar248._0_16_ = auVar222;
              auVar90 = vcmpps_avx(auVar99,_DAT_002f0280,2);
              auVar179 = vcvtdq2ps_avx(auVar248);
              auVar22._4_4_ =
                   (auVar179._4_4_ * 0.6931472 + fVar112 +
                   fVar112 * fVar112 *
                   (((((((((fVar112 * 0.070376836 + -0.1151461) * fVar112 + 0.116769984) * fVar112 +
                         -0.12420141) * fVar112 + 0.14249323) * fVar112 + -0.16668057) * fVar112 +
                      0.20000714) * fVar112 + -0.24999994) * fVar112 + 0.3333333) * fVar112 + -0.5))
                   * -2.0;
              auVar22._0_4_ =
                   (auVar179._0_4_ * 0.6931472 + fVar111 +
                   fVar111 * fVar111 *
                   (((((((((fVar111 * 0.070376836 + -0.1151461) * fVar111 + 0.116769984) * fVar111 +
                         -0.12420141) * fVar111 + 0.14249323) * fVar111 + -0.16668057) * fVar111 +
                      0.20000714) * fVar111 + -0.24999994) * fVar111 + 0.3333333) * fVar111 + -0.5))
                   * -2.0;
              auVar22._8_4_ =
                   (auVar179._8_4_ * 0.6931472 + fVar208 +
                   fVar208 * fVar208 *
                   (((((((((fVar208 * 0.070376836 + -0.1151461) * fVar208 + 0.116769984) * fVar208 +
                         -0.12420141) * fVar208 + 0.14249323) * fVar208 + -0.16668057) * fVar208 +
                      0.20000714) * fVar208 + -0.24999994) * fVar208 + 0.3333333) * fVar208 + -0.5))
                   * -2.0;
              auVar22._12_4_ =
                   (auVar179._12_4_ * 0.6931472 + fVar210 +
                   fVar210 * fVar210 *
                   (((((((((fVar210 * 0.070376836 + -0.1151461) * fVar210 + 0.116769984) * fVar210 +
                         -0.12420141) * fVar210 + 0.14249323) * fVar210 + -0.16668057) * fVar210 +
                      0.20000714) * fVar210 + -0.24999994) * fVar210 + 0.3333333) * fVar210 + -0.5))
                   * -2.0;
              auVar22._16_4_ =
                   (auVar179._16_4_ * 0.6931472 + fVar212 +
                   fVar212 * fVar212 *
                   (((((((((fVar212 * 0.070376836 + -0.1151461) * fVar212 + 0.116769984) * fVar212 +
                         -0.12420141) * fVar212 + 0.14249323) * fVar212 + -0.16668057) * fVar212 +
                      0.20000714) * fVar212 + -0.24999994) * fVar212 + 0.3333333) * fVar212 + -0.5))
                   * -2.0;
              auVar22._20_4_ =
                   (auVar179._20_4_ * 0.6931472 + fVar214 +
                   fVar214 * fVar214 *
                   (((((((((fVar214 * 0.070376836 + -0.1151461) * fVar214 + 0.116769984) * fVar214 +
                         -0.12420141) * fVar214 + 0.14249323) * fVar214 + -0.16668057) * fVar214 +
                      0.20000714) * fVar214 + -0.24999994) * fVar214 + 0.3333333) * fVar214 + -0.5))
                   * -2.0;
              auVar22._24_4_ =
                   (auVar179._24_4_ * 0.6931472 + fVar216 +
                   fVar216 * fVar216 *
                   (((((((((fVar216 * 0.070376836 + -0.1151461) * fVar216 + 0.116769984) * fVar216 +
                         -0.12420141) * fVar216 + 0.14249323) * fVar216 + -0.16668057) * fVar216 +
                      0.20000714) * fVar216 + -0.24999994) * fVar216 + 0.3333333) * fVar216 + -0.5))
                   * -2.0;
              auVar22._28_4_ = auVar179._28_4_ + auVar8._28_4_ + -1.0 + auVar89._28_4_ + 0.0;
              auVar249._8_4_ = 0x7fffffff;
              auVar249._0_8_ = 0x7fffffff7fffffff;
              auVar249._12_4_ = 0x7fffffff;
              auVar249._16_4_ = 0x7fffffff;
              auVar249._20_4_ = 0x7fffffff;
              auVar249._24_4_ = 0x7fffffff;
              auVar249._28_4_ = 0x7fffffff;
              auVar89 = vblendvps_avx(auVar22,auVar249,auVar90);
              auVar198._8_4_ = 0x42b0c0a5;
              auVar198._0_8_ = 0x42b0c0a542b0c0a5;
              auVar198._12_4_ = 0x42b0c0a5;
              auVar198._16_4_ = 0x42b0c0a5;
              auVar198._20_4_ = 0x42b0c0a5;
              auVar198._24_4_ = 0x42b0c0a5;
              auVar198._28_4_ = 0x42b0c0a5;
              auVar89 = vminps_avx(auVar89,auVar198);
              auVar199._8_4_ = 0xc2b0c0a5;
              auVar199._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar199._12_4_ = 0xc2b0c0a5;
              auVar199._16_4_ = 0xc2b0c0a5;
              auVar199._20_4_ = 0xc2b0c0a5;
              auVar199._24_4_ = 0xc2b0c0a5;
              auVar199._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar89,auVar199);
              auVar200._0_4_ = auVar90._0_4_ * 1.442695 + 0.5;
              auVar200._4_4_ = auVar90._4_4_ * 1.442695 + 0.5;
              auVar200._8_4_ = auVar90._8_4_ * 1.442695 + 0.5;
              auVar200._12_4_ = auVar90._12_4_ * 1.442695 + 0.5;
              auVar200._16_4_ = auVar90._16_4_ * 1.442695 + 0.5;
              auVar200._20_4_ = auVar90._20_4_ * 1.442695 + 0.5;
              auVar200._24_4_ = auVar90._24_4_ * 1.442695 + 0.5;
              auVar200._28_4_ = 0x3ff8aa3b;
              auVar179 = vroundps_avx(auVar200,1);
              auVar89 = vcmpps_avx(auVar200,auVar179,1);
              auVar89 = vandps_avx(auVar307,auVar89);
              auVar89 = vsubps_avx(auVar179,auVar89);
              auVar23._4_4_ = auVar89._4_4_ * 0.6931472;
              auVar23._0_4_ = auVar89._0_4_ * 0.6931472;
              auVar23._8_4_ = auVar89._8_4_ * 0.6931472;
              auVar23._12_4_ = auVar89._12_4_ * 0.6931472;
              auVar23._16_4_ = auVar89._16_4_ * 0.6931472;
              auVar23._20_4_ = auVar89._20_4_ * 0.6931472;
              auVar23._24_4_ = auVar89._24_4_ * 0.6931472;
              auVar23._28_4_ = auVar179._28_4_;
              auVar90 = vsubps_avx(auVar90,auVar23);
              fVar111 = auVar90._0_4_;
              fVar112 = auVar90._4_4_;
              fVar208 = auVar90._8_4_;
              fVar210 = auVar90._12_4_;
              fVar212 = auVar90._16_4_;
              fVar214 = auVar90._20_4_;
              fVar216 = auVar90._24_4_;
              auVar119._0_4_ = (int)auVar89._0_4_;
              auVar119._4_4_ = (int)auVar89._4_4_;
              auVar119._8_4_ = (int)auVar89._8_4_;
              auVar119._12_4_ = (int)auVar89._12_4_;
              auVar201._16_4_ = (int)auVar89._16_4_;
              auVar201._0_16_ = auVar119;
              auVar201._20_4_ = (int)auVar89._20_4_;
              auVar201._24_4_ = (int)auVar89._24_4_;
              auVar201._28_4_ = (int)auVar89._28_4_;
              auVar222 = vpslld_avx(auVar119,0x17);
              auVar113 = vpslld_avx(auVar201._16_16_,0x17);
              auVar113 = vpaddd_avx(auVar113,auVar283);
              auVar222 = vpaddd_avx(auVar222,auVar283);
              auVar100._0_4_ =
                   (fVar111 + 1.0 +
                   fVar111 * fVar111 *
                   (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
                     0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar222._0_4_ + 1.0;
              auVar100._4_4_ =
                   (fVar112 + 1.0 +
                   fVar112 * fVar112 *
                   (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
                     0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5)) * auVar222._4_4_ + 1.0;
              auVar100._8_4_ =
                   (fVar208 + 1.0 +
                   fVar208 * fVar208 *
                   (((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                     0.041665796) * fVar208 + 0.16666666) * fVar208 + 0.5)) * auVar222._8_4_ + 1.0;
              auVar100._12_4_ =
                   (fVar210 + 1.0 +
                   fVar210 * fVar210 *
                   (((((fVar210 * 0.00019875691 + 0.0013981999) * fVar210 + 0.008333452) * fVar210 +
                     0.041665796) * fVar210 + 0.16666666) * fVar210 + 0.5)) * auVar222._12_4_ + 1.0;
              auVar100._16_4_ =
                   (fVar212 + 1.0 +
                   fVar212 * fVar212 *
                   (((((fVar212 * 0.00019875691 + 0.0013981999) * fVar212 + 0.008333452) * fVar212 +
                     0.041665796) * fVar212 + 0.16666666) * fVar212 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar100._20_4_ =
                   (fVar214 + 1.0 +
                   fVar214 * fVar214 *
                   (((((fVar214 * 0.00019875691 + 0.0013981999) * fVar214 + 0.008333452) * fVar214 +
                     0.041665796) * fVar214 + 0.16666666) * fVar214 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar100._24_4_ =
                   (fVar216 + 1.0 +
                   fVar216 * fVar216 *
                   (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) * fVar216 +
                     0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar100._28_4_ = auVar90._28_4_ + 1.0 + auVar179._28_4_ + 1.0;
              auVar89 = vrcpps_avx(auVar100);
              fVar111 = auVar89._0_4_;
              fVar112 = auVar89._4_4_;
              fVar208 = auVar89._8_4_;
              fVar210 = auVar89._12_4_;
              fVar212 = auVar89._16_4_;
              fVar214 = auVar89._20_4_;
              fVar216 = auVar89._24_4_;
              auVar24._4_4_ = auVar100._4_4_ * (fVar112 + fVar112);
              auVar24._0_4_ = auVar100._0_4_ * (fVar111 + fVar111);
              auVar24._8_4_ = auVar100._8_4_ * (fVar208 + fVar208);
              auVar24._12_4_ = auVar100._12_4_ * (fVar210 + fVar210);
              auVar24._16_4_ = auVar100._16_4_ * (fVar212 + fVar212);
              auVar24._20_4_ = auVar100._20_4_ * (fVar214 + fVar214);
              auVar24._24_4_ = auVar100._24_4_ * (fVar216 + fVar216);
              auVar24._28_4_ = auVar100._28_4_;
              auVar267._8_4_ = 0x40000000;
              auVar267._0_8_ = 0x4000000040000000;
              auVar267._12_4_ = 0x40000000;
              auVar267._16_4_ = 0x40000000;
              auVar267._20_4_ = 0x40000000;
              auVar267._24_4_ = 0x40000000;
              auVar267._28_4_ = 0x40000000;
              auVar90 = vsubps_avx(auVar267,auVar24);
              fVar218 = fVar111 + fVar111 + -1.0;
              fVar209 = fVar112 + fVar112 + -1.0;
              fVar211 = fVar208 + fVar208 + -1.0;
              fVar213 = fVar210 + fVar210 + -1.0;
              fVar215 = fVar212 + fVar212 + -1.0;
              fVar217 = fVar214 + fVar214 + -1.0;
              fVar219 = fVar216 + fVar216 + -1.0;
              fVar220 = auVar89._28_4_ + auVar89._28_4_ + -1.0;
              in_ZMM1 = ZEXT3264(CONCAT428(fVar220,CONCAT424(fVar219,CONCAT420(fVar217,CONCAT416(
                                                  fVar215,CONCAT412(fVar213,CONCAT48(fVar211,
                                                  CONCAT44(fVar209,fVar218))))))));
              auVar105._4_4_ = (fVar209 + fVar112 * auVar90._4_4_) * fVar107;
              auVar105._0_4_ = (fVar218 + fVar111 * auVar90._0_4_) * fVar43;
              auVar105._8_4_ = (fVar211 + fVar208 * auVar90._8_4_) * fVar108;
              auVar105._12_4_ = (fVar213 + fVar210 * auVar90._12_4_) * fVar44;
              auVar105._16_4_ = (fVar215 + fVar212 * auVar90._16_4_) * fVar221;
              auVar105._20_4_ = (fVar217 + fVar214 * auVar90._20_4_) * fVar109;
              auVar105._24_4_ = (fVar219 + fVar216 * auVar90._24_4_) * fVar110;
              auVar105._28_4_ = fVar220 + auVar90._28_4_;
              break;
            case 6:
              fVar111 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar112 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar106._0_4_ = fVar111 * fVar43 + fVar112;
              auVar106._4_4_ = fVar111 * fVar107 + fVar112;
              auVar106._8_4_ = fVar111 * fVar108 + fVar112;
              auVar106._12_4_ = fVar111 * fVar44 + fVar112;
              auVar106._16_4_ = fVar111 * fVar221 + fVar112;
              auVar106._20_4_ = fVar111 * fVar109 + fVar112;
              auVar106._24_4_ = fVar111 * fVar110 + fVar112;
              auVar106._28_4_ = fVar111 + fVar112;
              auVar89 = vmaxps_avx(auVar106,ZEXT1632(auVar113));
              auVar207._8_4_ = 0x3f800000;
              auVar207._0_8_ = 0x3f8000003f800000;
              auVar207._12_4_ = 0x3f800000;
              auVar207._16_4_ = 0x3f800000;
              auVar207._20_4_ = 0x3f800000;
              auVar207._24_4_ = 0x3f800000;
              auVar207._28_4_ = 0x3f800000;
              in_ZMM1 = ZEXT3264(auVar207);
              auVar89 = vminps_avx(auVar89,auVar207);
              auVar105._4_4_ = auVar89._4_4_ * fVar107;
              auVar105._0_4_ = auVar89._0_4_ * fVar43;
              auVar105._8_4_ = auVar89._8_4_ * fVar108;
              auVar105._12_4_ = auVar89._12_4_ * fVar44;
              auVar105._16_4_ = auVar89._16_4_ * fVar221;
              auVar105._20_4_ = auVar89._20_4_ * fVar109;
              auVar105._24_4_ = auVar89._24_4_ * fVar110;
              auVar105._28_4_ = auVar89._28_4_;
            }
switchD_002e359e_caseD_1:
            *pauVar30 = auVar105;
            pauVar30 = pauVar30 + 1;
          }
        }
      }
      lVar28 = (long)iVar29;
      if ((iVar2 == 8) && (_elempack == 1)) {
        uVar40 = 0;
        if (0 < iVar26) {
          uVar40 = (ulong)(uint)iVar26;
        }
        uVar33 = 0;
        if (0 < iVar39) {
          uVar33 = uVar27;
        }
        for (uVar32 = 0; uVar32 != uVar33; uVar32 = uVar32 + 1) {
          iVar35 = top_blob->w;
          sVar5 = top_blob->elemsize;
          pvVar6 = top_blob->data;
          for (lVar41 = 0; auVar89 = _local_118, lVar41 <= lVar28; lVar41 = lVar41 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx[-3]) == 0) {
              fVar43 = 0.0;
            }
            else {
              fVar43 = *(float *)(*(long *)(&this->field_0x190 +
                                           (long)this->_vptr_Convolution1D_x86_avx[-3]) + uVar32 * 4
                                 );
            }
            local_118._0_4_ = fVar43;
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar32);
            pfVar34 = (float *)local_80.data;
            Mat::~Mat(&local_80);
            fVar107 = 0.0;
            fVar108 = 0.0;
            fVar44 = 0.0;
            fVar221 = 0.0;
            fVar109 = 0.0;
            fVar110 = 0.0;
            fVar111 = 0.0;
            fVar112 = 0.0;
            for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar37 = (float *)((long)bottom_blob_bordered.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * (int)lVar41 * 8
                                       ) * 4 +
                                 (long)bottom_blob_bordered.w * bottom_blob_bordered.elemsize *
                                 uVar36);
              iVar38 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar38 = 0;
              }
              while (bVar42 = iVar38 != 0, iVar38 = iVar38 + -1, bVar42) {
                fVar44 = *pfVar34 * *pfVar37 + fVar44;
                fVar221 = pfVar34[1] * pfVar37[1] + fVar221;
                fVar107 = pfVar34[2] * pfVar37[2] + fVar107;
                fVar108 = pfVar34[3] * pfVar37[3] + fVar108;
                fVar109 = pfVar34[4] * pfVar37[4] + fVar109;
                fVar110 = pfVar34[5] * pfVar37[5] + fVar110;
                fVar111 = pfVar34[6] * pfVar37[6] + fVar111;
                fVar112 = pfVar34[7] + fVar112;
                pfVar37 = pfVar37 + (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * 8;
                pfVar34 = pfVar34 + 8;
              }
            }
            auVar45._0_4_ = fVar109 + fVar44;
            auVar45._4_4_ = fVar110 + fVar221;
            auVar45._8_4_ = fVar111 + fVar107;
            auVar45._12_4_ = fVar112 + fVar108;
            auVar113 = vshufpd_avx(auVar45,auVar45,1);
            auVar46._0_4_ = auVar113._0_4_ + auVar45._0_4_;
            auVar46._4_4_ = auVar113._4_4_ + auVar45._4_4_;
            auVar46._8_4_ = auVar113._8_4_ + auVar45._8_4_;
            auVar46._12_4_ = auVar113._12_4_ + auVar45._12_4_;
            auVar113 = vmovshdup_avx(auVar46);
            fVar43 = auVar113._0_4_ + auVar46._0_4_ + fVar43;
            p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
            auVar113 = ZEXT416((uint)fVar43);
            fVar107 = fVar43;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
            case 1:
              auVar113 = vmaxss_avx(ZEXT416((uint)fVar43),ZEXT416(0));
              fVar107 = auVar113._0_4_;
              break;
            case 2:
              auVar47._0_12_ = ZEXT812(0);
              auVar47._12_4_ = 0;
              auVar113 = vcmpss_avx(auVar47,auVar113,1);
              auVar223._8_4_ = 0x3f800000;
              auVar223._0_8_ = 0x3f8000003f800000;
              auVar223._12_4_ = 0x3f800000;
              auVar113 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                       auVar223,auVar113);
              fVar107 = auVar113._0_4_ * fVar43;
              break;
            case 3:
              auVar113 = vmaxss_avx(auVar113,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)))
              ;
              auVar113 = vminss_avx(auVar113,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4))
                                                     [1]));
              fVar107 = auVar113._0_4_;
              break;
            case 4:
              fVar43 = expf(-fVar43);
              fVar107 = 1.0 / (fVar43 + 1.0);
              break;
            case 5:
              _fStack_108 = auVar89._16_16_;
              _local_118 = auVar113;
              fVar107 = expf(fVar43);
              fVar107 = logf(fVar107 + 1.0);
              fVar107 = tanhf(fVar107);
              fVar107 = fVar107 * fVar43;
              break;
            case 6:
              fVar108 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar44 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              fVar221 = -fVar44 / fVar108;
              fVar107 = 0.0;
              if ((fVar221 <= fVar43) && (fVar107 = fVar43, fVar43 <= fVar221 + 1.0 / fVar108)) {
                fVar107 = (fVar108 * fVar43 + fVar44) * fVar43;
              }
            }
            *(float *)((long)pvVar6 + lVar41 * 4 + (long)iVar35 * uVar32 * sVar5) = fVar107;
          }
        }
      }
      if ((iVar2 == 8) && (_elempack == 4)) {
        uVar40 = 0;
        if (0 < iVar26) {
          uVar40 = (ulong)(uint)iVar26;
        }
        uVar33 = 0;
        if (0 < iVar39) {
          uVar33 = uVar27;
        }
        for (uVar32 = 0; uVar32 != uVar33; uVar32 = uVar32 + 1) {
          pauVar31 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
          for (iVar35 = 0; iVar35 <= iVar29; iVar35 = iVar35 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx[-3]) == 0) {
              auVar113 = ZEXT816(0) << 0x40;
            }
            else {
              auVar113 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 +
                                    (long)this->_vptr_Convolution1D_x86_avx[-3]) + uVar32 * 0x10);
            }
            _local_118 = auVar113;
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar32);
            pfVar34 = (float *)local_80.data;
            Mat::~Mat(&local_80);
            for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar37 = (float *)((long)bottom_blob_bordered.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar35 * 8) * 4
                                 + (long)bottom_blob_bordered.w * bottom_blob_bordered.elemsize *
                                   uVar36);
              iVar38 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar38 = 0;
              }
              while (auVar89 = _local_118, bVar42 = iVar38 != 0, iVar38 = iVar38 + -1, bVar42) {
                fVar43 = *pfVar37;
                fVar107 = pfVar37[1];
                fVar108 = pfVar37[2];
                fVar44 = pfVar37[3];
                fVar221 = pfVar37[4];
                fVar109 = pfVar37[5];
                fVar110 = pfVar37[6];
                fVar111 = pfVar37[7];
                local_118._4_4_ =
                     fVar43 * pfVar34[1] + (float)local_118._4_4_ +
                     fVar107 * pfVar34[5] + fVar108 * pfVar34[9] +
                     fVar44 * pfVar34[0xd] + fVar221 * pfVar34[0x11] + fVar109 * pfVar34[0x15] +
                     fVar110 * pfVar34[0x19] + fVar111 * pfVar34[0x1d];
                local_118._0_4_ =
                     fVar43 * *pfVar34 + (float)local_118._0_4_ +
                     fVar107 * pfVar34[4] + fVar108 * pfVar34[8] +
                     fVar44 * pfVar34[0xc] + fVar221 * pfVar34[0x10] + fVar109 * pfVar34[0x14] +
                     fVar110 * pfVar34[0x18] + fVar111 * pfVar34[0x1c];
                fStack_110 = fVar43 * pfVar34[2] + fStack_110 +
                             fVar107 * pfVar34[6] + fVar108 * pfVar34[10] +
                             fVar44 * pfVar34[0xe] + fVar221 * pfVar34[0x12] +
                             fVar109 * pfVar34[0x16] +
                             fVar110 * pfVar34[0x1a] + fVar111 * pfVar34[0x1e];
                fStack_10c = fVar43 * pfVar34[3] + fStack_10c +
                             fVar107 * pfVar34[7] + fVar108 * pfVar34[0xb] +
                             fVar44 * pfVar34[0xf] + fVar221 * pfVar34[0x13] +
                             fVar109 * pfVar34[0x17] +
                             fVar110 * pfVar34[0x1b] + fVar111 * pfVar34[0x1f];
                _fStack_108 = auVar89._16_16_;
                pfVar37 = pfVar37 + (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * 8;
                pfVar34 = pfVar34 + 0x20;
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
            auVar56 = _local_118;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto switchD_002e3fa9_caseD_1;
            auVar113 = ZEXT816(0) << 0x40;
            auVar56 = vmaxps_avx(_local_118,auVar113);
            fVar43 = local_118._8_4_;
            fVar107 = local_118._12_4_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar113 = vminps_avx(_local_118,auVar113);
              fVar43 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar121._0_4_ = fVar43 * auVar113._0_4_;
              auVar121._4_4_ = fVar43 * auVar113._4_4_;
              auVar121._8_4_ = fVar43 * auVar113._8_4_;
              auVar121._12_4_ = fVar43 * auVar113._12_4_;
              goto LAB_002e43b5;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar52._4_4_ = uVar1;
              auVar52._0_4_ = uVar1;
              auVar52._8_4_ = uVar1;
              auVar52._12_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar130._4_4_ = uVar1;
              auVar130._0_4_ = uVar1;
              auVar130._8_4_ = uVar1;
              auVar130._12_4_ = uVar1;
              auVar113 = vmaxps_avx(_local_118,auVar52);
              auVar56 = vminps_avx(auVar113,auVar130);
              break;
            case 4:
              auVar53._0_8_ = local_118 ^ 0x8000000080000000;
              auVar53._8_4_ = -fVar43;
              auVar53._12_4_ = -fVar107;
              auVar131._8_4_ = 0x42b0c0a5;
              auVar131._0_8_ = 0x42b0c0a542b0c0a5;
              auVar131._12_4_ = 0x42b0c0a5;
              auVar113 = vminps_avx(auVar53,auVar131);
              auVar132._8_4_ = 0xc2b0c0a5;
              auVar132._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar132._12_4_ = 0xc2b0c0a5;
              auVar272 = vmaxps_avx(auVar113,auVar132);
              auVar133._0_4_ = auVar272._0_4_ * 1.442695 + 0.5;
              auVar133._4_4_ = auVar272._4_4_ * 1.442695 + 0.5;
              auVar133._8_4_ = auVar272._8_4_ * 1.442695 + 0.5;
              auVar133._12_4_ = auVar272._12_4_ * 1.442695 + 0.5;
              auVar229._0_4_ = (int)auVar133._0_4_;
              auVar229._4_4_ = (int)auVar133._4_4_;
              auVar229._8_4_ = (int)auVar133._8_4_;
              auVar229._12_4_ = (int)auVar133._12_4_;
              auVar222 = vcvtdq2ps_avx(auVar229);
              auVar113 = vcmpps_avx(auVar133,auVar222,1);
              auVar275._8_4_ = 0x3f800000;
              auVar275._0_8_ = 0x3f8000003f800000;
              auVar275._12_4_ = 0x3f800000;
              auVar113 = vandps_avx(auVar113,auVar275);
              auVar113 = vsubps_avx(auVar222,auVar113);
              fVar43 = auVar272._0_4_ + auVar113._0_4_ * -0.6931472;
              fVar107 = auVar272._4_4_ + auVar113._4_4_ * -0.6931472;
              fVar108 = auVar272._8_4_ + auVar113._8_4_ * -0.6931472;
              fVar44 = auVar272._12_4_ + auVar113._12_4_ * -0.6931472;
              auVar134._0_4_ = (int)auVar113._0_4_;
              auVar134._4_4_ = (int)auVar113._4_4_;
              auVar134._8_4_ = (int)auVar113._8_4_;
              auVar134._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar134,0x17);
              auVar113 = vpaddd_avx(auVar113,auVar275);
              auVar54._0_4_ =
                   (fVar43 + 1.0 +
                   fVar43 * fVar43 *
                   (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                     0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar54._4_4_ =
                   (fVar107 + 1.0 +
                   fVar107 * fVar107 *
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar54._8_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar54._12_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar113._12_4_ + 1.0;
              auVar121 = vrcpps_avx(auVar54);
              auVar55._0_4_ = auVar54._0_4_ * auVar121._0_4_;
              auVar55._4_4_ = auVar54._4_4_ * auVar121._4_4_;
              auVar55._8_4_ = auVar54._8_4_ * auVar121._8_4_;
              auVar55._12_4_ = auVar54._12_4_ * auVar121._12_4_;
              auVar113 = vsubps_avx(auVar275,auVar55);
              auVar56._0_4_ = auVar121._0_4_ * auVar113._0_4_;
              auVar56._4_4_ = auVar121._4_4_ * auVar113._4_4_;
              auVar56._8_4_ = auVar121._8_4_ * auVar113._8_4_;
              auVar56._12_4_ = auVar121._12_4_ * auVar113._12_4_;
LAB_002e43b5:
              auVar57._0_4_ = auVar121._0_4_ + auVar56._0_4_;
              auVar57._4_4_ = auVar121._4_4_ + auVar56._4_4_;
              auVar57._8_4_ = auVar121._8_4_ + auVar56._8_4_;
              auVar57._12_4_ = auVar121._12_4_ + auVar56._12_4_;
              auVar56 = auVar57;
              break;
            case 5:
              auVar284._8_4_ = 0x42b0c0a5;
              auVar284._0_8_ = 0x42b0c0a542b0c0a5;
              auVar284._12_4_ = 0x42b0c0a5;
              auVar113 = vminps_avx(_local_118,auVar284);
              auVar290._8_4_ = 0xc2b0c0a5;
              auVar290._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar290._12_4_ = 0xc2b0c0a5;
              auVar272 = vmaxps_avx(auVar113,auVar290);
              auVar296._8_4_ = 0x3f000000;
              auVar296._0_8_ = 0x3f0000003f000000;
              auVar296._12_4_ = 0x3f000000;
              auVar122._0_4_ = auVar272._0_4_ * 1.442695 + 0.5;
              auVar122._4_4_ = auVar272._4_4_ * 1.442695 + 0.5;
              auVar122._8_4_ = auVar272._8_4_ * 1.442695 + 0.5;
              auVar122._12_4_ = auVar272._12_4_ * 1.442695 + 0.5;
              auVar224._0_4_ = (int)auVar122._0_4_;
              auVar224._4_4_ = (int)auVar122._4_4_;
              auVar224._8_4_ = (int)auVar122._8_4_;
              auVar224._12_4_ = (int)auVar122._12_4_;
              auVar222 = vcvtdq2ps_avx(auVar224);
              auVar113 = vcmpps_avx(auVar122,auVar222,1);
              auVar302._8_4_ = 0x3f800000;
              auVar302._0_8_ = 0x3f8000003f800000;
              auVar302._12_4_ = 0x3f800000;
              auVar113 = vandps_avx(auVar302,auVar113);
              auVar113 = vsubps_avx(auVar222,auVar113);
              auVar225._0_4_ = auVar113._0_4_ * 0.6931472;
              auVar225._4_4_ = auVar113._4_4_ * 0.6931472;
              auVar225._8_4_ = auVar113._8_4_ * 0.6931472;
              auVar225._12_4_ = auVar113._12_4_ * 0.6931472;
              auVar222 = vsubps_avx(auVar272,auVar225);
              fVar108 = auVar222._0_4_;
              fVar44 = auVar222._4_4_;
              fVar221 = auVar222._8_4_;
              fVar109 = auVar222._12_4_;
              auVar123._0_4_ = (int)auVar113._0_4_;
              auVar123._4_4_ = (int)auVar113._4_4_;
              auVar123._8_4_ = (int)auVar113._8_4_;
              auVar123._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar123,0x17);
              auVar113 = vpaddd_avx(auVar302,auVar113);
              auVar48._0_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar48._4_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar48._8_4_ =
                   (fVar221 + 1.0 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar48._12_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar113._12_4_ + 1.0;
              auVar124._8_4_ = 0x800000;
              auVar124._0_8_ = 0x80000000800000;
              auVar124._12_4_ = 0x800000;
              auVar113 = vmaxps_avx(auVar48,auVar124);
              auVar222 = vpsrld_avx(auVar113,0x17);
              auVar253._8_4_ = 0xffffff82;
              auVar253._0_8_ = 0xffffff82ffffff82;
              auVar253._12_4_ = 0xffffff82;
              auVar222 = vpaddd_avx(auVar222,auVar253);
              auVar254._8_4_ = 0x807fffff;
              auVar254._0_8_ = 0x807fffff807fffff;
              auVar254._12_4_ = 0x807fffff;
              auVar113 = vandps_avx(auVar113,auVar254);
              auVar281 = vorps_avx(auVar296,auVar113);
              auVar272 = vcvtdq2ps_avx(auVar222);
              auVar255._8_4_ = 0x3f3504f3;
              auVar255._0_8_ = 0x3f3504f33f3504f3;
              auVar255._12_4_ = 0x3f3504f3;
              auVar222 = vcmpps_avx(auVar281,auVar255,1);
              auVar113 = vandps_avx(auVar222,auVar281);
              fVar108 = auVar281._0_4_ + -1.0 + auVar113._0_4_;
              fVar44 = auVar281._4_4_ + -1.0 + auVar113._4_4_;
              fVar221 = auVar281._8_4_ + -1.0 + auVar113._8_4_;
              fVar109 = auVar281._12_4_ + -1.0 + auVar113._12_4_;
              auVar113 = vandps_avx(auVar302,auVar222);
              auVar222 = vsubps_avx(auVar272,auVar113);
              auVar113 = vcmpps_avx(auVar48,_DAT_002eb070,2);
              auVar125._0_4_ =
                   (auVar222._0_4_ * 0.6931472 + fVar108 +
                   fVar108 * fVar108 *
                   (((((((((fVar108 * 0.070376836 + -0.1151461) * fVar108 + 0.116769984) * fVar108 +
                         -0.12420141) * fVar108 + 0.14249323) * fVar108 + -0.16668057) * fVar108 +
                      0.20000714) * fVar108 + -0.24999994) * fVar108 + 0.3333333) * fVar108 + -0.5))
                   * -2.0;
              auVar125._4_4_ =
                   (auVar222._4_4_ * 0.6931472 + fVar44 +
                   fVar44 * fVar44 *
                   (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                         -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 +
                      0.20000714) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5)) *
                   -2.0;
              auVar125._8_4_ =
                   (auVar222._8_4_ * 0.6931472 + fVar221 +
                   fVar221 * fVar221 *
                   (((((((((fVar221 * 0.070376836 + -0.1151461) * fVar221 + 0.116769984) * fVar221 +
                         -0.12420141) * fVar221 + 0.14249323) * fVar221 + -0.16668057) * fVar221 +
                      0.20000714) * fVar221 + -0.24999994) * fVar221 + 0.3333333) * fVar221 + -0.5))
                   * -2.0;
              auVar125._12_4_ =
                   (auVar222._12_4_ * 0.6931472 + fVar109 +
                   fVar109 * fVar109 *
                   (((((((((fVar109 * 0.070376836 + -0.1151461) * fVar109 + 0.116769984) * fVar109 +
                         -0.12420141) * fVar109 + 0.14249323) * fVar109 + -0.16668057) * fVar109 +
                      0.20000714) * fVar109 + -0.24999994) * fVar109 + 0.3333333) * fVar109 + -0.5))
                   * -2.0;
              auVar226._8_4_ = 0x7fffffff;
              auVar226._0_8_ = 0x7fffffff7fffffff;
              auVar226._12_4_ = 0x7fffffff;
              auVar113 = vblendvps_avx(auVar125,auVar226,auVar113);
              auVar126._8_4_ = 0x42b0c0a5;
              auVar126._0_8_ = 0x42b0c0a542b0c0a5;
              auVar126._12_4_ = 0x42b0c0a5;
              auVar113 = vminps_avx(auVar113,auVar126);
              auVar127._8_4_ = 0xc2b0c0a5;
              auVar127._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar127._12_4_ = 0xc2b0c0a5;
              auVar272 = vmaxps_avx(auVar113,auVar127);
              auVar128._0_4_ = auVar272._0_4_ * 1.442695 + 0.5;
              auVar128._4_4_ = auVar272._4_4_ * 1.442695 + 0.5;
              auVar128._8_4_ = auVar272._8_4_ * 1.442695 + 0.5;
              auVar128._12_4_ = auVar272._12_4_ * 1.442695 + 0.5;
              auVar227._0_4_ = (int)auVar128._0_4_;
              auVar227._4_4_ = (int)auVar128._4_4_;
              auVar227._8_4_ = (int)auVar128._8_4_;
              auVar227._12_4_ = (int)auVar128._12_4_;
              auVar222 = vcvtdq2ps_avx(auVar227);
              auVar113 = vcmpps_avx(auVar128,auVar222,1);
              auVar113 = vandps_avx(auVar302,auVar113);
              auVar113 = vsubps_avx(auVar222,auVar113);
              auVar228._0_4_ = auVar113._0_4_ * 0.6931472;
              auVar228._4_4_ = auVar113._4_4_ * 0.6931472;
              auVar228._8_4_ = auVar113._8_4_ * 0.6931472;
              auVar228._12_4_ = auVar113._12_4_ * 0.6931472;
              auVar222 = vsubps_avx(auVar272,auVar228);
              fVar108 = auVar222._0_4_;
              fVar44 = auVar222._4_4_;
              fVar221 = auVar222._8_4_;
              fVar109 = auVar222._12_4_;
              auVar129._0_4_ = (int)auVar113._0_4_;
              auVar129._4_4_ = (int)auVar113._4_4_;
              auVar129._8_4_ = (int)auVar113._8_4_;
              auVar129._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar129,0x17);
              auVar113 = vpaddd_avx(auVar302,auVar113);
              auVar49._0_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar49._4_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar49._8_4_ =
                   (fVar221 + 1.0 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar49._12_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar113._12_4_ + 1.0;
              auVar113 = vrcpps_avx(auVar49);
              fVar108 = auVar113._0_4_;
              fVar44 = auVar113._4_4_;
              fVar221 = auVar113._8_4_;
              fVar109 = auVar113._12_4_;
              auVar50._0_4_ = auVar49._0_4_ * (fVar108 + fVar108);
              auVar50._4_4_ = auVar49._4_4_ * (fVar44 + fVar44);
              auVar50._8_4_ = auVar49._8_4_ * (fVar221 + fVar221);
              auVar50._12_4_ = auVar49._12_4_ * (fVar109 + fVar109);
              auVar256._8_4_ = 0x40000000;
              auVar256._0_8_ = 0x4000000040000000;
              auVar256._12_4_ = 0x40000000;
              auVar113 = vsubps_avx(auVar256,auVar50);
              auVar51._0_4_ = fVar108 + fVar108 + -1.0 + fVar108 * auVar113._0_4_;
              auVar51._4_4_ = fVar44 + fVar44 + -1.0 + fVar44 * auVar113._4_4_;
              auVar51._8_4_ = fVar221 + fVar221 + -1.0 + fVar221 * auVar113._8_4_;
              auVar51._12_4_ = fVar109 + fVar109 + -1.0 + fVar109 * auVar113._12_4_;
              goto LAB_002e43e7;
            case 6:
              fVar108 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar44 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar58._0_4_ = fVar108 * local_118._0_4_ + fVar44;
              auVar58._4_4_ = fVar108 * local_118._4_4_ + fVar44;
              auVar58._8_4_ = fVar108 * fVar43 + fVar44;
              auVar58._12_4_ = fVar108 * fVar107 + fVar44;
              auVar113 = vmaxps_avx(auVar58,auVar113);
              auVar135._8_4_ = 0x3f800000;
              auVar135._0_8_ = 0x3f8000003f800000;
              auVar135._12_4_ = 0x3f800000;
              auVar51 = vminps_avx(auVar113,auVar135);
LAB_002e43e7:
              auVar56._0_4_ = auVar51._0_4_ * local_118._0_4_;
              auVar56._4_4_ = auVar51._4_4_ * local_118._4_4_;
              auVar56._8_4_ = auVar51._8_4_ * fVar43;
              auVar56._12_4_ = auVar51._12_4_ * fVar107;
            }
switchD_002e3fa9_caseD_1:
            *pauVar31 = auVar56;
            pauVar31 = pauVar31 + 1;
          }
        }
      }
      if ((iVar2 == 4) && (_elempack == 4)) {
        uVar40 = 0;
        if (0 < iVar26) {
          uVar40 = (ulong)(uint)iVar26;
        }
        local_38 = 0;
        if (0 < iVar39) {
          local_38 = uVar27;
        }
        for (uVar33 = 0; uVar33 != local_38; uVar33 = uVar33 + 1) {
          pauVar31 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar33 * top_blob->elemsize + (long)top_blob->data);
          for (iVar35 = 0; iVar35 <= iVar29; iVar35 = iVar35 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx[-3]) == 0) {
              auVar113 = ZEXT816(0) << 0x40;
            }
            else {
              auVar113 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 +
                                    (long)this->_vptr_Convolution1D_x86_avx[-3]) + uVar33 * 0x10);
            }
            _local_118 = auVar113;
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar33);
            pfVar34 = (float *)local_80.data;
            Mat::~Mat(&local_80);
            for (uVar32 = 0; uVar32 != uVar40; uVar32 = uVar32 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar37 = (float *)((long)bottom_blob_bordered.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar35 * 4) * 4
                                 + (long)bottom_blob_bordered.w * bottom_blob_bordered.elemsize *
                                   uVar32);
              iVar38 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar38 = 0;
              }
              while (auVar89 = _local_118, bVar42 = iVar38 != 0, iVar38 = iVar38 + -1, bVar42) {
                fVar43 = *pfVar37;
                fVar107 = pfVar37[1];
                fVar108 = pfVar37[2];
                fVar44 = pfVar37[3];
                local_118._4_4_ =
                     fVar43 * pfVar34[1] + (float)local_118._4_4_ +
                     fVar107 * pfVar34[5] + fVar108 * pfVar34[9] + fVar44 * pfVar34[0xd];
                local_118._0_4_ =
                     fVar43 * *pfVar34 + (float)local_118._0_4_ +
                     fVar107 * pfVar34[4] + fVar108 * pfVar34[8] + fVar44 * pfVar34[0xc];
                fStack_110 = fVar43 * pfVar34[2] + fStack_110 +
                             fVar107 * pfVar34[6] + fVar108 * pfVar34[10] + fVar44 * pfVar34[0xe];
                fStack_10c = fVar43 * pfVar34[3] + fStack_10c +
                             fVar107 * pfVar34[7] + fVar108 * pfVar34[0xb] + fVar44 * pfVar34[0xf];
                _fStack_108 = auVar89._16_16_;
                pfVar37 = pfVar37 + (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * 4;
                pfVar34 = pfVar34 + 0x10;
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
            auVar67 = _local_118;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto switchD_002e4618_caseD_1;
            auVar113 = ZEXT816(0) << 0x40;
            auVar67 = vmaxps_avx(_local_118,auVar113);
            fVar43 = local_118._8_4_;
            fVar107 = local_118._12_4_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar113 = vminps_avx(_local_118,auVar113);
              fVar43 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar136._0_4_ = fVar43 * auVar113._0_4_;
              auVar136._4_4_ = fVar43 * auVar113._4_4_;
              auVar136._8_4_ = fVar43 * auVar113._8_4_;
              auVar136._12_4_ = fVar43 * auVar113._12_4_;
              goto LAB_002e4a24;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar63._4_4_ = uVar1;
              auVar63._0_4_ = uVar1;
              auVar63._8_4_ = uVar1;
              auVar63._12_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar145._4_4_ = uVar1;
              auVar145._0_4_ = uVar1;
              auVar145._8_4_ = uVar1;
              auVar145._12_4_ = uVar1;
              auVar113 = vmaxps_avx(_local_118,auVar63);
              auVar67 = vminps_avx(auVar113,auVar145);
              break;
            case 4:
              auVar64._0_8_ = local_118 ^ 0x8000000080000000;
              auVar64._8_4_ = -fVar43;
              auVar64._12_4_ = -fVar107;
              auVar146._8_4_ = 0x42b0c0a5;
              auVar146._0_8_ = 0x42b0c0a542b0c0a5;
              auVar146._12_4_ = 0x42b0c0a5;
              auVar113 = vminps_avx(auVar64,auVar146);
              auVar147._8_4_ = 0xc2b0c0a5;
              auVar147._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar147._12_4_ = 0xc2b0c0a5;
              auVar272 = vmaxps_avx(auVar113,auVar147);
              auVar148._0_4_ = auVar272._0_4_ * 1.442695 + 0.5;
              auVar148._4_4_ = auVar272._4_4_ * 1.442695 + 0.5;
              auVar148._8_4_ = auVar272._8_4_ * 1.442695 + 0.5;
              auVar148._12_4_ = auVar272._12_4_ * 1.442695 + 0.5;
              auVar235._0_4_ = (int)auVar148._0_4_;
              auVar235._4_4_ = (int)auVar148._4_4_;
              auVar235._8_4_ = (int)auVar148._8_4_;
              auVar235._12_4_ = (int)auVar148._12_4_;
              auVar222 = vcvtdq2ps_avx(auVar235);
              auVar113 = vcmpps_avx(auVar148,auVar222,1);
              auVar276._8_4_ = 0x3f800000;
              auVar276._0_8_ = 0x3f8000003f800000;
              auVar276._12_4_ = 0x3f800000;
              auVar113 = vandps_avx(auVar113,auVar276);
              auVar113 = vsubps_avx(auVar222,auVar113);
              fVar43 = auVar272._0_4_ + auVar113._0_4_ * -0.6931472;
              fVar107 = auVar272._4_4_ + auVar113._4_4_ * -0.6931472;
              fVar108 = auVar272._8_4_ + auVar113._8_4_ * -0.6931472;
              fVar44 = auVar272._12_4_ + auVar113._12_4_ * -0.6931472;
              auVar149._0_4_ = (int)auVar113._0_4_;
              auVar149._4_4_ = (int)auVar113._4_4_;
              auVar149._8_4_ = (int)auVar113._8_4_;
              auVar149._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar149,0x17);
              auVar113 = vpaddd_avx(auVar113,auVar276);
              auVar65._0_4_ =
                   (fVar43 + 1.0 +
                   fVar43 * fVar43 *
                   (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                     0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar65._4_4_ =
                   (fVar107 + 1.0 +
                   fVar107 * fVar107 *
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar65._8_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar65._12_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar113._12_4_ + 1.0;
              auVar136 = vrcpps_avx(auVar65);
              auVar66._0_4_ = auVar65._0_4_ * auVar136._0_4_;
              auVar66._4_4_ = auVar65._4_4_ * auVar136._4_4_;
              auVar66._8_4_ = auVar65._8_4_ * auVar136._8_4_;
              auVar66._12_4_ = auVar65._12_4_ * auVar136._12_4_;
              auVar113 = vsubps_avx(auVar276,auVar66);
              auVar67._0_4_ = auVar136._0_4_ * auVar113._0_4_;
              auVar67._4_4_ = auVar136._4_4_ * auVar113._4_4_;
              auVar67._8_4_ = auVar136._8_4_ * auVar113._8_4_;
              auVar67._12_4_ = auVar136._12_4_ * auVar113._12_4_;
LAB_002e4a24:
              auVar68._0_4_ = auVar136._0_4_ + auVar67._0_4_;
              auVar68._4_4_ = auVar136._4_4_ + auVar67._4_4_;
              auVar68._8_4_ = auVar136._8_4_ + auVar67._8_4_;
              auVar68._12_4_ = auVar136._12_4_ + auVar67._12_4_;
              auVar67 = auVar68;
              break;
            case 5:
              auVar285._8_4_ = 0x42b0c0a5;
              auVar285._0_8_ = 0x42b0c0a542b0c0a5;
              auVar285._12_4_ = 0x42b0c0a5;
              auVar113 = vminps_avx(_local_118,auVar285);
              auVar291._8_4_ = 0xc2b0c0a5;
              auVar291._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar291._12_4_ = 0xc2b0c0a5;
              auVar272 = vmaxps_avx(auVar113,auVar291);
              auVar297._8_4_ = 0x3f000000;
              auVar297._0_8_ = 0x3f0000003f000000;
              auVar297._12_4_ = 0x3f000000;
              auVar137._0_4_ = auVar272._0_4_ * 1.442695 + 0.5;
              auVar137._4_4_ = auVar272._4_4_ * 1.442695 + 0.5;
              auVar137._8_4_ = auVar272._8_4_ * 1.442695 + 0.5;
              auVar137._12_4_ = auVar272._12_4_ * 1.442695 + 0.5;
              auVar230._0_4_ = (int)auVar137._0_4_;
              auVar230._4_4_ = (int)auVar137._4_4_;
              auVar230._8_4_ = (int)auVar137._8_4_;
              auVar230._12_4_ = (int)auVar137._12_4_;
              auVar222 = vcvtdq2ps_avx(auVar230);
              auVar113 = vcmpps_avx(auVar137,auVar222,1);
              auVar303._8_4_ = 0x3f800000;
              auVar303._0_8_ = 0x3f8000003f800000;
              auVar303._12_4_ = 0x3f800000;
              auVar113 = vandps_avx(auVar303,auVar113);
              auVar113 = vsubps_avx(auVar222,auVar113);
              auVar231._0_4_ = auVar113._0_4_ * 0.6931472;
              auVar231._4_4_ = auVar113._4_4_ * 0.6931472;
              auVar231._8_4_ = auVar113._8_4_ * 0.6931472;
              auVar231._12_4_ = auVar113._12_4_ * 0.6931472;
              auVar222 = vsubps_avx(auVar272,auVar231);
              fVar108 = auVar222._0_4_;
              fVar44 = auVar222._4_4_;
              fVar221 = auVar222._8_4_;
              fVar109 = auVar222._12_4_;
              auVar138._0_4_ = (int)auVar113._0_4_;
              auVar138._4_4_ = (int)auVar113._4_4_;
              auVar138._8_4_ = (int)auVar113._8_4_;
              auVar138._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar138,0x17);
              auVar113 = vpaddd_avx(auVar303,auVar113);
              auVar59._0_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar59._4_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar59._8_4_ =
                   (fVar221 + 1.0 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar59._12_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar113._12_4_ + 1.0;
              auVar139._8_4_ = 0x800000;
              auVar139._0_8_ = 0x80000000800000;
              auVar139._12_4_ = 0x800000;
              auVar113 = vmaxps_avx(auVar59,auVar139);
              auVar222 = vpsrld_avx(auVar113,0x17);
              auVar257._8_4_ = 0xffffff82;
              auVar257._0_8_ = 0xffffff82ffffff82;
              auVar257._12_4_ = 0xffffff82;
              auVar222 = vpaddd_avx(auVar222,auVar257);
              auVar258._8_4_ = 0x807fffff;
              auVar258._0_8_ = 0x807fffff807fffff;
              auVar258._12_4_ = 0x807fffff;
              auVar113 = vandps_avx(auVar113,auVar258);
              auVar281 = vorps_avx(auVar297,auVar113);
              auVar272 = vcvtdq2ps_avx(auVar222);
              auVar259._8_4_ = 0x3f3504f3;
              auVar259._0_8_ = 0x3f3504f33f3504f3;
              auVar259._12_4_ = 0x3f3504f3;
              auVar222 = vcmpps_avx(auVar281,auVar259,1);
              auVar113 = vandps_avx(auVar222,auVar281);
              fVar108 = auVar281._0_4_ + -1.0 + auVar113._0_4_;
              fVar44 = auVar281._4_4_ + -1.0 + auVar113._4_4_;
              fVar221 = auVar281._8_4_ + -1.0 + auVar113._8_4_;
              fVar109 = auVar281._12_4_ + -1.0 + auVar113._12_4_;
              auVar113 = vandps_avx(auVar303,auVar222);
              auVar222 = vsubps_avx(auVar272,auVar113);
              auVar113 = vcmpps_avx(auVar59,_DAT_002eb070,2);
              auVar140._0_4_ =
                   (auVar222._0_4_ * 0.6931472 + fVar108 +
                   fVar108 * fVar108 *
                   (((((((((fVar108 * 0.070376836 + -0.1151461) * fVar108 + 0.116769984) * fVar108 +
                         -0.12420141) * fVar108 + 0.14249323) * fVar108 + -0.16668057) * fVar108 +
                      0.20000714) * fVar108 + -0.24999994) * fVar108 + 0.3333333) * fVar108 + -0.5))
                   * -2.0;
              auVar140._4_4_ =
                   (auVar222._4_4_ * 0.6931472 + fVar44 +
                   fVar44 * fVar44 *
                   (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                         -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 +
                      0.20000714) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5)) *
                   -2.0;
              auVar140._8_4_ =
                   (auVar222._8_4_ * 0.6931472 + fVar221 +
                   fVar221 * fVar221 *
                   (((((((((fVar221 * 0.070376836 + -0.1151461) * fVar221 + 0.116769984) * fVar221 +
                         -0.12420141) * fVar221 + 0.14249323) * fVar221 + -0.16668057) * fVar221 +
                      0.20000714) * fVar221 + -0.24999994) * fVar221 + 0.3333333) * fVar221 + -0.5))
                   * -2.0;
              auVar140._12_4_ =
                   (auVar222._12_4_ * 0.6931472 + fVar109 +
                   fVar109 * fVar109 *
                   (((((((((fVar109 * 0.070376836 + -0.1151461) * fVar109 + 0.116769984) * fVar109 +
                         -0.12420141) * fVar109 + 0.14249323) * fVar109 + -0.16668057) * fVar109 +
                      0.20000714) * fVar109 + -0.24999994) * fVar109 + 0.3333333) * fVar109 + -0.5))
                   * -2.0;
              auVar232._8_4_ = 0x7fffffff;
              auVar232._0_8_ = 0x7fffffff7fffffff;
              auVar232._12_4_ = 0x7fffffff;
              auVar113 = vblendvps_avx(auVar140,auVar232,auVar113);
              auVar141._8_4_ = 0x42b0c0a5;
              auVar141._0_8_ = 0x42b0c0a542b0c0a5;
              auVar141._12_4_ = 0x42b0c0a5;
              auVar113 = vminps_avx(auVar113,auVar141);
              auVar142._8_4_ = 0xc2b0c0a5;
              auVar142._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar142._12_4_ = 0xc2b0c0a5;
              auVar272 = vmaxps_avx(auVar113,auVar142);
              auVar143._0_4_ = auVar272._0_4_ * 1.442695 + 0.5;
              auVar143._4_4_ = auVar272._4_4_ * 1.442695 + 0.5;
              auVar143._8_4_ = auVar272._8_4_ * 1.442695 + 0.5;
              auVar143._12_4_ = auVar272._12_4_ * 1.442695 + 0.5;
              auVar233._0_4_ = (int)auVar143._0_4_;
              auVar233._4_4_ = (int)auVar143._4_4_;
              auVar233._8_4_ = (int)auVar143._8_4_;
              auVar233._12_4_ = (int)auVar143._12_4_;
              auVar222 = vcvtdq2ps_avx(auVar233);
              auVar113 = vcmpps_avx(auVar143,auVar222,1);
              auVar113 = vandps_avx(auVar303,auVar113);
              auVar113 = vsubps_avx(auVar222,auVar113);
              auVar234._0_4_ = auVar113._0_4_ * 0.6931472;
              auVar234._4_4_ = auVar113._4_4_ * 0.6931472;
              auVar234._8_4_ = auVar113._8_4_ * 0.6931472;
              auVar234._12_4_ = auVar113._12_4_ * 0.6931472;
              auVar222 = vsubps_avx(auVar272,auVar234);
              fVar108 = auVar222._0_4_;
              fVar44 = auVar222._4_4_;
              fVar221 = auVar222._8_4_;
              fVar109 = auVar222._12_4_;
              auVar144._0_4_ = (int)auVar113._0_4_;
              auVar144._4_4_ = (int)auVar113._4_4_;
              auVar144._8_4_ = (int)auVar113._8_4_;
              auVar144._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar144,0x17);
              auVar113 = vpaddd_avx(auVar303,auVar113);
              auVar60._0_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar60._4_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar60._8_4_ =
                   (fVar221 + 1.0 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar60._12_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar113._12_4_ + 1.0;
              auVar113 = vrcpps_avx(auVar60);
              fVar108 = auVar113._0_4_;
              fVar44 = auVar113._4_4_;
              fVar221 = auVar113._8_4_;
              fVar109 = auVar113._12_4_;
              auVar61._0_4_ = auVar60._0_4_ * (fVar108 + fVar108);
              auVar61._4_4_ = auVar60._4_4_ * (fVar44 + fVar44);
              auVar61._8_4_ = auVar60._8_4_ * (fVar221 + fVar221);
              auVar61._12_4_ = auVar60._12_4_ * (fVar109 + fVar109);
              auVar260._8_4_ = 0x40000000;
              auVar260._0_8_ = 0x4000000040000000;
              auVar260._12_4_ = 0x40000000;
              auVar113 = vsubps_avx(auVar260,auVar61);
              auVar62._0_4_ = fVar108 + fVar108 + -1.0 + fVar108 * auVar113._0_4_;
              auVar62._4_4_ = fVar44 + fVar44 + -1.0 + fVar44 * auVar113._4_4_;
              auVar62._8_4_ = fVar221 + fVar221 + -1.0 + fVar221 * auVar113._8_4_;
              auVar62._12_4_ = fVar109 + fVar109 + -1.0 + fVar109 * auVar113._12_4_;
              goto LAB_002e4a56;
            case 6:
              fVar108 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar44 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar69._0_4_ = fVar108 * local_118._0_4_ + fVar44;
              auVar69._4_4_ = fVar108 * local_118._4_4_ + fVar44;
              auVar69._8_4_ = fVar108 * fVar43 + fVar44;
              auVar69._12_4_ = fVar108 * fVar107 + fVar44;
              auVar113 = vmaxps_avx(auVar69,auVar113);
              auVar150._8_4_ = 0x3f800000;
              auVar150._0_8_ = 0x3f8000003f800000;
              auVar150._12_4_ = 0x3f800000;
              auVar62 = vminps_avx(auVar113,auVar150);
LAB_002e4a56:
              auVar67._0_4_ = auVar62._0_4_ * local_118._0_4_;
              auVar67._4_4_ = auVar62._4_4_ * local_118._4_4_;
              auVar67._8_4_ = auVar62._8_4_ * fVar43;
              auVar67._12_4_ = auVar62._12_4_ * fVar107;
            }
switchD_002e4618_caseD_1:
            *pauVar31 = auVar67;
            pauVar31 = pauVar31 + 1;
          }
        }
      }
      if ((iVar2 == 1) && (_elempack == 4)) {
        uVar40 = 0;
        if (0 < iVar26) {
          uVar40 = (ulong)(uint)iVar26;
        }
        uVar33 = 0;
        if (0 < iVar39) {
          uVar33 = uVar27;
        }
        for (uVar32 = 0; uVar32 != uVar33; uVar32 = uVar32 + 1) {
          pauVar31 = (undefined1 (*) [16])
                     ((long)top_blob->w * uVar32 * top_blob->elemsize + (long)top_blob->data);
          for (iVar35 = 0; iVar35 <= iVar29; iVar35 = iVar35 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx[-3]) == 0) {
              auVar113 = ZEXT816(0) << 0x40;
            }
            else {
              auVar113 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 +
                                    (long)this->_vptr_Convolution1D_x86_avx[-3]) + uVar32 * 0x10);
            }
            _local_118 = auVar113;
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar32);
            pfVar34 = (float *)local_80.data;
            Mat::~Mat(&local_80);
            for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar37 = (float *)((long)bottom_blob_bordered.data +
                                 (long)iVar35 * (long)*(int *)(&this->field_0xdc + (long)p_Var4) * 4
                                 + (long)bottom_blob_bordered.w * bottom_blob_bordered.elemsize *
                                   uVar36);
              iVar38 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar38 = 0;
              }
              while (auVar89 = _local_118, bVar42 = iVar38 != 0, iVar38 = iVar38 + -1, bVar42) {
                fVar43 = *pfVar37;
                local_118._4_4_ = fVar43 * pfVar34[1] + (float)local_118._4_4_;
                local_118._0_4_ = fVar43 * *pfVar34 + (float)local_118._0_4_;
                fStack_110 = fVar43 * pfVar34[2] + fStack_110;
                fStack_10c = fVar43 * pfVar34[3] + fStack_10c;
                _fStack_108 = auVar89._16_16_;
                pfVar37 = pfVar37 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                pfVar34 = pfVar34 + 4;
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
            auVar79 = _local_118;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var4) - 1U) goto LAB_002e508d;
            auVar113 = ZEXT816(0) << 0x40;
            auVar78 = vmaxps_avx(_local_118,auVar113);
            fVar43 = local_118._8_4_;
            fVar107 = local_118._12_4_;
            auVar79 = auVar78;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var4)) {
            case 2:
              auVar113 = vminps_avx(_local_118,auVar113);
              fVar43 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              auVar151._0_4_ = fVar43 * auVar113._0_4_;
              auVar151._4_4_ = fVar43 * auVar113._4_4_;
              auVar151._8_4_ = fVar43 * auVar113._8_4_;
              auVar151._12_4_ = fVar43 * auVar113._12_4_;
              goto LAB_002e5052;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
              auVar74._4_4_ = uVar1;
              auVar74._0_4_ = uVar1;
              auVar74._8_4_ = uVar1;
              auVar74._12_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar160._4_4_ = uVar1;
              auVar160._0_4_ = uVar1;
              auVar160._8_4_ = uVar1;
              auVar160._12_4_ = uVar1;
              auVar113 = vmaxps_avx(_local_118,auVar74);
              auVar79 = vminps_avx(auVar113,auVar160);
              break;
            case 4:
              auVar75._0_8_ = local_118 ^ 0x8000000080000000;
              auVar75._8_4_ = -fVar43;
              auVar75._12_4_ = -fVar107;
              auVar161._8_4_ = 0x42b0c0a5;
              auVar161._0_8_ = 0x42b0c0a542b0c0a5;
              auVar161._12_4_ = 0x42b0c0a5;
              auVar113 = vminps_avx(auVar75,auVar161);
              auVar162._8_4_ = 0xc2b0c0a5;
              auVar162._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar162._12_4_ = 0xc2b0c0a5;
              auVar272 = vmaxps_avx(auVar113,auVar162);
              auVar163._0_4_ = auVar272._0_4_ * 1.442695 + 0.5;
              auVar163._4_4_ = auVar272._4_4_ * 1.442695 + 0.5;
              auVar163._8_4_ = auVar272._8_4_ * 1.442695 + 0.5;
              auVar163._12_4_ = auVar272._12_4_ * 1.442695 + 0.5;
              auVar241._0_4_ = (int)auVar163._0_4_;
              auVar241._4_4_ = (int)auVar163._4_4_;
              auVar241._8_4_ = (int)auVar163._8_4_;
              auVar241._12_4_ = (int)auVar163._12_4_;
              auVar222 = vcvtdq2ps_avx(auVar241);
              auVar113 = vcmpps_avx(auVar163,auVar222,1);
              auVar277._8_4_ = 0x3f800000;
              auVar277._0_8_ = 0x3f8000003f800000;
              auVar277._12_4_ = 0x3f800000;
              auVar113 = vandps_avx(auVar113,auVar277);
              auVar113 = vsubps_avx(auVar222,auVar113);
              fVar43 = auVar272._0_4_ + auVar113._0_4_ * -0.6931472;
              fVar107 = auVar272._4_4_ + auVar113._4_4_ * -0.6931472;
              fVar108 = auVar272._8_4_ + auVar113._8_4_ * -0.6931472;
              fVar44 = auVar272._12_4_ + auVar113._12_4_ * -0.6931472;
              auVar164._0_4_ = (int)auVar113._0_4_;
              auVar164._4_4_ = (int)auVar113._4_4_;
              auVar164._8_4_ = (int)auVar113._8_4_;
              auVar164._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar164,0x17);
              auVar113 = vpaddd_avx(auVar113,auVar277);
              auVar76._0_4_ =
                   (fVar43 + 1.0 +
                   fVar43 * fVar43 *
                   (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                     0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar76._4_4_ =
                   (fVar107 + 1.0 +
                   fVar107 * fVar107 *
                   (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107 +
                     0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar76._8_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar76._12_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar113._12_4_ + 1.0;
              auVar151 = vrcpps_avx(auVar76);
              auVar77._0_4_ = auVar76._0_4_ * auVar151._0_4_;
              auVar77._4_4_ = auVar76._4_4_ * auVar151._4_4_;
              auVar77._8_4_ = auVar76._8_4_ * auVar151._8_4_;
              auVar77._12_4_ = auVar76._12_4_ * auVar151._12_4_;
              auVar113 = vsubps_avx(auVar277,auVar77);
              auVar78._0_4_ = auVar151._0_4_ * auVar113._0_4_;
              auVar78._4_4_ = auVar151._4_4_ * auVar113._4_4_;
              auVar78._8_4_ = auVar151._8_4_ * auVar113._8_4_;
              auVar78._12_4_ = auVar151._12_4_ * auVar113._12_4_;
LAB_002e5052:
              auVar79._0_4_ = auVar151._0_4_ + auVar78._0_4_;
              auVar79._4_4_ = auVar151._4_4_ + auVar78._4_4_;
              auVar79._8_4_ = auVar151._8_4_ + auVar78._8_4_;
              auVar79._12_4_ = auVar151._12_4_ + auVar78._12_4_;
              break;
            case 5:
              auVar286._8_4_ = 0x42b0c0a5;
              auVar286._0_8_ = 0x42b0c0a542b0c0a5;
              auVar286._12_4_ = 0x42b0c0a5;
              auVar113 = vminps_avx(_local_118,auVar286);
              auVar292._8_4_ = 0xc2b0c0a5;
              auVar292._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar292._12_4_ = 0xc2b0c0a5;
              auVar272 = vmaxps_avx(auVar113,auVar292);
              auVar298._8_4_ = 0x3f000000;
              auVar298._0_8_ = 0x3f0000003f000000;
              auVar298._12_4_ = 0x3f000000;
              auVar152._0_4_ = auVar272._0_4_ * 1.442695 + 0.5;
              auVar152._4_4_ = auVar272._4_4_ * 1.442695 + 0.5;
              auVar152._8_4_ = auVar272._8_4_ * 1.442695 + 0.5;
              auVar152._12_4_ = auVar272._12_4_ * 1.442695 + 0.5;
              auVar236._0_4_ = (int)auVar152._0_4_;
              auVar236._4_4_ = (int)auVar152._4_4_;
              auVar236._8_4_ = (int)auVar152._8_4_;
              auVar236._12_4_ = (int)auVar152._12_4_;
              auVar222 = vcvtdq2ps_avx(auVar236);
              auVar113 = vcmpps_avx(auVar152,auVar222,1);
              auVar304._8_4_ = 0x3f800000;
              auVar304._0_8_ = 0x3f8000003f800000;
              auVar304._12_4_ = 0x3f800000;
              auVar113 = vandps_avx(auVar304,auVar113);
              auVar113 = vsubps_avx(auVar222,auVar113);
              auVar237._0_4_ = auVar113._0_4_ * 0.6931472;
              auVar237._4_4_ = auVar113._4_4_ * 0.6931472;
              auVar237._8_4_ = auVar113._8_4_ * 0.6931472;
              auVar237._12_4_ = auVar113._12_4_ * 0.6931472;
              auVar222 = vsubps_avx(auVar272,auVar237);
              fVar108 = auVar222._0_4_;
              fVar44 = auVar222._4_4_;
              fVar221 = auVar222._8_4_;
              fVar109 = auVar222._12_4_;
              auVar153._0_4_ = (int)auVar113._0_4_;
              auVar153._4_4_ = (int)auVar113._4_4_;
              auVar153._8_4_ = (int)auVar113._8_4_;
              auVar153._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar153,0x17);
              auVar113 = vpaddd_avx(auVar304,auVar113);
              auVar70._0_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar70._4_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar70._8_4_ =
                   (fVar221 + 1.0 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar70._12_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar113._12_4_ + 1.0;
              auVar154._8_4_ = 0x800000;
              auVar154._0_8_ = 0x80000000800000;
              auVar154._12_4_ = 0x800000;
              auVar113 = vmaxps_avx(auVar70,auVar154);
              auVar222 = vpsrld_avx(auVar113,0x17);
              auVar261._8_4_ = 0xffffff82;
              auVar261._0_8_ = 0xffffff82ffffff82;
              auVar261._12_4_ = 0xffffff82;
              auVar222 = vpaddd_avx(auVar222,auVar261);
              auVar262._8_4_ = 0x807fffff;
              auVar262._0_8_ = 0x807fffff807fffff;
              auVar262._12_4_ = 0x807fffff;
              auVar113 = vandps_avx(auVar113,auVar262);
              auVar281 = vorps_avx(auVar298,auVar113);
              auVar272 = vcvtdq2ps_avx(auVar222);
              auVar263._8_4_ = 0x3f3504f3;
              auVar263._0_8_ = 0x3f3504f33f3504f3;
              auVar263._12_4_ = 0x3f3504f3;
              auVar222 = vcmpps_avx(auVar281,auVar263,1);
              auVar113 = vandps_avx(auVar222,auVar281);
              fVar108 = auVar281._0_4_ + -1.0 + auVar113._0_4_;
              fVar44 = auVar281._4_4_ + -1.0 + auVar113._4_4_;
              fVar221 = auVar281._8_4_ + -1.0 + auVar113._8_4_;
              fVar109 = auVar281._12_4_ + -1.0 + auVar113._12_4_;
              auVar113 = vandps_avx(auVar304,auVar222);
              auVar222 = vsubps_avx(auVar272,auVar113);
              auVar113 = vcmpps_avx(auVar70,_DAT_002eb070,2);
              auVar155._0_4_ =
                   (auVar222._0_4_ * 0.6931472 + fVar108 +
                   fVar108 * fVar108 *
                   (((((((((fVar108 * 0.070376836 + -0.1151461) * fVar108 + 0.116769984) * fVar108 +
                         -0.12420141) * fVar108 + 0.14249323) * fVar108 + -0.16668057) * fVar108 +
                      0.20000714) * fVar108 + -0.24999994) * fVar108 + 0.3333333) * fVar108 + -0.5))
                   * -2.0;
              auVar155._4_4_ =
                   (auVar222._4_4_ * 0.6931472 + fVar44 +
                   fVar44 * fVar44 *
                   (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                         -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 +
                      0.20000714) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5)) *
                   -2.0;
              auVar155._8_4_ =
                   (auVar222._8_4_ * 0.6931472 + fVar221 +
                   fVar221 * fVar221 *
                   (((((((((fVar221 * 0.070376836 + -0.1151461) * fVar221 + 0.116769984) * fVar221 +
                         -0.12420141) * fVar221 + 0.14249323) * fVar221 + -0.16668057) * fVar221 +
                      0.20000714) * fVar221 + -0.24999994) * fVar221 + 0.3333333) * fVar221 + -0.5))
                   * -2.0;
              auVar155._12_4_ =
                   (auVar222._12_4_ * 0.6931472 + fVar109 +
                   fVar109 * fVar109 *
                   (((((((((fVar109 * 0.070376836 + -0.1151461) * fVar109 + 0.116769984) * fVar109 +
                         -0.12420141) * fVar109 + 0.14249323) * fVar109 + -0.16668057) * fVar109 +
                      0.20000714) * fVar109 + -0.24999994) * fVar109 + 0.3333333) * fVar109 + -0.5))
                   * -2.0;
              auVar238._8_4_ = 0x7fffffff;
              auVar238._0_8_ = 0x7fffffff7fffffff;
              auVar238._12_4_ = 0x7fffffff;
              auVar113 = vblendvps_avx(auVar155,auVar238,auVar113);
              auVar156._8_4_ = 0x42b0c0a5;
              auVar156._0_8_ = 0x42b0c0a542b0c0a5;
              auVar156._12_4_ = 0x42b0c0a5;
              auVar113 = vminps_avx(auVar113,auVar156);
              auVar157._8_4_ = 0xc2b0c0a5;
              auVar157._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar157._12_4_ = 0xc2b0c0a5;
              auVar272 = vmaxps_avx(auVar113,auVar157);
              auVar158._0_4_ = auVar272._0_4_ * 1.442695 + 0.5;
              auVar158._4_4_ = auVar272._4_4_ * 1.442695 + 0.5;
              auVar158._8_4_ = auVar272._8_4_ * 1.442695 + 0.5;
              auVar158._12_4_ = auVar272._12_4_ * 1.442695 + 0.5;
              auVar239._0_4_ = (int)auVar158._0_4_;
              auVar239._4_4_ = (int)auVar158._4_4_;
              auVar239._8_4_ = (int)auVar158._8_4_;
              auVar239._12_4_ = (int)auVar158._12_4_;
              auVar222 = vcvtdq2ps_avx(auVar239);
              auVar113 = vcmpps_avx(auVar158,auVar222,1);
              auVar113 = vandps_avx(auVar304,auVar113);
              auVar113 = vsubps_avx(auVar222,auVar113);
              auVar240._0_4_ = auVar113._0_4_ * 0.6931472;
              auVar240._4_4_ = auVar113._4_4_ * 0.6931472;
              auVar240._8_4_ = auVar113._8_4_ * 0.6931472;
              auVar240._12_4_ = auVar113._12_4_ * 0.6931472;
              auVar222 = vsubps_avx(auVar272,auVar240);
              fVar108 = auVar222._0_4_;
              fVar44 = auVar222._4_4_;
              fVar221 = auVar222._8_4_;
              fVar109 = auVar222._12_4_;
              auVar159._0_4_ = (int)auVar113._0_4_;
              auVar159._4_4_ = (int)auVar113._4_4_;
              auVar159._8_4_ = (int)auVar113._8_4_;
              auVar159._12_4_ = (int)auVar113._12_4_;
              auVar113 = vpslld_avx(auVar159,0x17);
              auVar113 = vpaddd_avx(auVar304,auVar113);
              auVar71._0_4_ =
                   (fVar108 + 1.0 +
                   fVar108 * fVar108 *
                   (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108 +
                     0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5)) * auVar113._0_4_ + 1.0;
              auVar71._4_4_ =
                   (fVar44 + 1.0 +
                   fVar44 * fVar44 *
                   (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                     0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar113._4_4_ + 1.0;
              auVar71._8_4_ =
                   (fVar221 + 1.0 +
                   fVar221 * fVar221 *
                   (((((fVar221 * 0.00019875691 + 0.0013981999) * fVar221 + 0.008333452) * fVar221 +
                     0.041665796) * fVar221 + 0.16666666) * fVar221 + 0.5)) * auVar113._8_4_ + 1.0;
              auVar71._12_4_ =
                   (fVar109 + 1.0 +
                   fVar109 * fVar109 *
                   (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
                     0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar113._12_4_ + 1.0;
              auVar113 = vrcpps_avx(auVar71);
              fVar108 = auVar113._0_4_;
              fVar44 = auVar113._4_4_;
              fVar221 = auVar113._8_4_;
              fVar109 = auVar113._12_4_;
              auVar72._0_4_ = auVar71._0_4_ * (fVar108 + fVar108);
              auVar72._4_4_ = auVar71._4_4_ * (fVar44 + fVar44);
              auVar72._8_4_ = auVar71._8_4_ * (fVar221 + fVar221);
              auVar72._12_4_ = auVar71._12_4_ * (fVar109 + fVar109);
              auVar264._8_4_ = 0x40000000;
              auVar264._0_8_ = 0x4000000040000000;
              auVar264._12_4_ = 0x40000000;
              auVar113 = vsubps_avx(auVar264,auVar72);
              auVar73._0_4_ = fVar108 + fVar108 + -1.0 + fVar108 * auVar113._0_4_;
              auVar73._4_4_ = fVar44 + fVar44 + -1.0 + fVar44 * auVar113._4_4_;
              auVar73._8_4_ = fVar221 + fVar221 + -1.0 + fVar221 * auVar113._8_4_;
              auVar73._12_4_ = fVar109 + fVar109 + -1.0 + fVar109 * auVar113._12_4_;
              goto LAB_002e5084;
            case 6:
              fVar108 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar44 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              auVar80._0_4_ = fVar108 * local_118._0_4_ + fVar44;
              auVar80._4_4_ = fVar108 * local_118._4_4_ + fVar44;
              auVar80._8_4_ = fVar108 * fVar43 + fVar44;
              auVar80._12_4_ = fVar108 * fVar107 + fVar44;
              auVar113 = vmaxps_avx(auVar80,auVar113);
              auVar165._8_4_ = 0x3f800000;
              auVar165._0_8_ = 0x3f8000003f800000;
              auVar165._12_4_ = 0x3f800000;
              auVar73 = vminps_avx(auVar113,auVar165);
LAB_002e5084:
              auVar79._0_4_ = auVar73._0_4_ * local_118._0_4_;
              auVar79._4_4_ = auVar73._4_4_ * local_118._4_4_;
              auVar79._8_4_ = auVar73._8_4_ * fVar43;
              auVar79._12_4_ = auVar73._12_4_ * fVar107;
            }
LAB_002e508d:
            *pauVar31 = auVar79;
            pauVar31 = pauVar31 + 1;
          }
        }
      }
      if ((iVar2 == 4) && (_elempack == 1)) {
        uVar40 = 0;
        if (0 < iVar26) {
          uVar40 = (ulong)(uint)iVar26;
        }
        uVar33 = 0;
        if (0 < iVar39) {
          uVar33 = uVar27;
        }
        for (uVar32 = 0; uVar32 != uVar33; uVar32 = uVar32 + 1) {
          iVar29 = top_blob->w;
          sVar5 = top_blob->elemsize;
          pvVar6 = top_blob->data;
          for (lVar41 = 0; lVar41 <= lVar28; lVar41 = lVar41 + 1) {
            if (*(int *)(&this->field_0xec + (long)this->_vptr_Convolution1D_x86_avx[-3]) == 0) {
              auVar113 = ZEXT816(0) << 0x40;
            }
            else {
              auVar113 = ZEXT416(*(uint *)(*(long *)(&this->field_0x190 +
                                                    (long)this->_vptr_Convolution1D_x86_avx[-3]) +
                                          uVar32 * 4));
            }
            _local_118 = auVar113;
            Mat::channel(&local_80,&this->weight_data_packed,(int)uVar32);
            pfVar34 = (float *)local_80.data;
            Mat::~Mat(&local_80);
            for (uVar36 = 0; uVar36 != uVar40; uVar36 = uVar36 + 1) {
              p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
              pfVar37 = (float *)((long)bottom_blob_bordered.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * (int)lVar41 * 4
                                       ) * 4 +
                                 (long)bottom_blob_bordered.w * bottom_blob_bordered.elemsize *
                                 uVar36);
              iVar35 = *(int *)(&this->field_0xd4 + (long)p_Var4);
              if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                iVar35 = 0;
              }
              while (bVar42 = iVar35 != 0, iVar35 = iVar35 + -1, bVar42) {
                auVar81._0_4_ = *pfVar34 * *pfVar37;
                auVar81._4_4_ = pfVar34[1] * pfVar37[1];
                auVar81._8_4_ = pfVar34[2] * pfVar37[2];
                auVar81._12_4_ = pfVar34[3] * pfVar37[3];
                auVar113 = vshufpd_avx(auVar81,auVar81,1);
                auVar82._0_4_ = auVar113._0_4_ + auVar81._0_4_;
                auVar82._4_4_ = auVar113._4_4_ + auVar81._4_4_;
                auVar82._8_4_ = auVar113._8_4_ + auVar81._8_4_;
                auVar82._12_4_ = auVar113._12_4_ + auVar81._12_4_;
                auVar113 = vmovshdup_avx(auVar82);
                _local_118 = ZEXT416((uint)(auVar113._0_4_ + auVar82._0_4_ + (float)local_118._0_4_)
                                    );
                pfVar37 = pfVar37 + (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * 4;
                pfVar34 = pfVar34 + 4;
              }
            }
            p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
            auVar113 = _local_118;
            fVar43 = (float)local_118._0_4_;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
            case 1:
              auVar113 = vmaxss_avx(auVar113,ZEXT416(0));
              fVar43 = auVar113._0_4_;
              break;
            case 2:
              auVar113 = vcmpss_avx(ZEXT816(0) << 0x40,auVar113,1);
              auVar242._8_4_ = 0x3f800000;
              auVar242._0_8_ = 0x3f8000003f800000;
              auVar242._12_4_ = 0x3f800000;
              auVar113 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                       auVar242,auVar113);
              fVar43 = auVar113._0_4_ * (float)local_118._0_4_;
              break;
            case 3:
              auVar113 = vmaxss_avx(auVar113,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)))
              ;
              auVar113 = vminss_avx(auVar113,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4))
                                                     [1]));
              fVar43 = auVar113._0_4_;
              break;
            case 4:
              fVar43 = expf(-(float)local_118._0_4_);
              fVar43 = 1.0 / (fVar43 + 1.0);
              break;
            case 5:
              fVar43 = expf((float)local_118._0_4_);
              fVar43 = logf(fVar43 + 1.0);
              fVar43 = tanhf(fVar43);
              fVar43 = fVar43 * (float)local_118._0_4_;
              break;
            case 6:
              fVar107 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar108 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              fVar44 = -fVar108 / fVar107;
              fVar43 = 0.0;
              if ((fVar44 <= (float)local_118._0_4_) &&
                 (fVar43 = (float)local_118._0_4_, (float)local_118._0_4_ <= fVar44 + 1.0 / fVar107)
                 ) {
                fVar43 = (fVar107 * (float)local_118._0_4_ + fVar108) * (float)local_118._0_4_;
              }
            }
            *(float *)((long)pvVar6 + lVar41 * 4 + (long)iVar29 * uVar32 * sVar5) = fVar43;
          }
        }
      }
      local_128 = 0;
      if ((iVar2 == 1) && (_elempack == 1)) {
        pvVar6 = top_blob->data;
        iVar2 = top_blob->w;
        sVar5 = top_blob->elemsize;
        uVar40 = 0;
        if (0 < iVar26) {
          uVar40 = (ulong)(uint)iVar26;
        }
        local_128 = 0;
        if (iVar39 < 1) {
          uVar27 = 0;
        }
        for (uVar33 = 0; uVar33 != uVar27; uVar33 = uVar33 + 1) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx;
          for (lVar41 = 0; lVar41 <= lVar28; lVar41 = lVar41 + 1) {
            p_Var4 = pp_Var7[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
              auVar271 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar271 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) + uVar33 * 4
                                          ));
            }
            iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var4);
            pfVar34 = (float *)((long)(iVar26 * (int)uVar33 * iVar29) * 4 +
                               *(long *)(&this->field_0x148 + (long)p_Var4));
            if (iVar29 < 1) {
              iVar29 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar40; uVar32 = uVar32 + 1) {
              pfVar37 = (float *)((long)bottom_blob_bordered.data +
                                 (long)*(int *)(&this->field_0xdc + (long)p_Var4) *
                                 (long)(int)lVar41 * 4 +
                                 (long)bottom_blob_bordered.w * bottom_blob_bordered.elemsize *
                                 uVar32);
              iVar39 = iVar29;
              while (bVar42 = iVar39 != 0, iVar39 = iVar39 + -1, bVar42) {
                auVar271 = ZEXT464((uint)(*pfVar34 * *pfVar37 + auVar271._0_4_));
                pfVar37 = pfVar37 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                pfVar34 = pfVar34 + 1;
              }
            }
            auVar113 = auVar271._0_16_;
            fVar107 = auVar271._0_4_;
            fVar43 = fVar107;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
            case 1:
              auVar113 = vmaxss_avx(auVar113,ZEXT416(0));
              fVar43 = auVar113._0_4_;
              break;
            case 2:
              auVar113 = vcmpss_avx(ZEXT816(0) << 0x40,auVar113,1);
              auVar243._8_4_ = 0x3f800000;
              auVar243._0_8_ = 0x3f8000003f800000;
              auVar243._12_4_ = 0x3f800000;
              auVar113 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                       auVar243,auVar113);
              fVar44 = auVar113._0_4_;
LAB_002e55d4:
              fVar43 = fVar44 * fVar107;
              break;
            case 3:
              auVar113 = vmaxss_avx(auVar113,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)))
              ;
              auVar113 = vminss_avx(auVar113,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4))
                                                     [1]));
              fVar43 = auVar113._0_4_;
              break;
            case 4:
              fVar43 = expf(-fVar107);
              fVar43 = 1.0 / (fVar43 + 1.0);
              break;
            case 5:
              fVar43 = expf(fVar107);
              fVar43 = logf(fVar43 + 1.0);
              fVar43 = tanhf(fVar43);
              fVar43 = fVar43 * fVar107;
              break;
            case 6:
              fVar108 = **(float **)(&this->field_0xf8 + (long)p_Var4);
              fVar44 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
              fVar221 = -fVar44 / fVar108;
              fVar43 = 0.0;
              if ((fVar221 <= fVar107) && (fVar43 = fVar107, fVar107 <= fVar221 + 1.0 / fVar108)) {
                fVar44 = fVar108 * fVar107 + fVar44;
                goto LAB_002e55d4;
              }
            }
            *(float *)((long)pvVar6 + lVar41 * 4 + (long)iVar2 * sVar5 * uVar33) = fVar43;
          }
        }
      }
    }
  }
  Mat::~Mat(&bottom_blob_bordered);
  return local_128;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}